

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  RTCRayQueryContext *pRVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  int iVar78;
  uint uVar79;
  uint uVar80;
  long lVar81;
  uint uVar82;
  ulong uVar83;
  ulong uVar84;
  undefined4 uVar85;
  undefined8 unaff_R13;
  ulong uVar86;
  bool bVar87;
  float fVar88;
  undefined8 uVar89;
  vint4 bi_2;
  undefined1 auVar90 [16];
  float fVar122;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar94 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar158 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar163;
  vint4 ai_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 ai;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar215;
  float fVar216;
  vint4 bi;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar206 [32];
  float fVar217;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar221;
  float fVar229;
  float fVar230;
  vint4 ai_1;
  float fVar231;
  undefined1 auVar224 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar228 [64];
  undefined1 auVar235 [16];
  undefined1 auVar239 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar240 [64];
  float fVar241;
  float fVar245;
  float fVar246;
  undefined1 auVar242 [16];
  float fVar247;
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [28];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar260 [32];
  undefined1 auVar258 [16];
  undefined1 auVar261 [32];
  undefined1 auVar259 [16];
  undefined1 auVar262 [32];
  undefined1 auVar264 [64];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float s;
  float fVar273;
  float fVar274;
  undefined1 auVar272 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar289;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_cc4;
  uint uStack_c44;
  uint uStack_c24;
  uint uStack_c04;
  float local_c00;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  RTCFilterFunctionNArguments local_b90;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [16];
  undefined4 uStack_b10;
  undefined4 uStack_b0c;
  undefined4 uStack_b08;
  undefined4 uStack_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 (*local_aa8) [32];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 auStack_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  Primitive *local_a08;
  ulong local_a00;
  undefined1 auStack_9f8 [24];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [32];
  uint local_7a0;
  uint uStack_79c;
  uint uStack_798;
  uint uStack_794;
  uint uStack_790;
  uint uStack_78c;
  uint uStack_788;
  uint uStack_784;
  uint local_780;
  uint uStack_77c;
  uint uStack_778;
  uint uStack_774;
  uint uStack_770;
  uint uStack_76c;
  uint uStack_768;
  uint uStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined4 local_700;
  undefined4 uStack_6fc;
  undefined4 uStack_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  undefined4 uStack_6e8;
  undefined4 uStack_6e4;
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined4 local_6c0;
  undefined4 uStack_6bc;
  undefined4 uStack_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined4 uStack_6a8;
  undefined4 uStack_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  uint local_440;
  uint uStack_43c;
  uint uStack_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar263 [64];
  undefined1 auVar271 [64];
  
  PVar1 = prim[1];
  uVar86 = (ulong)(byte)PVar1;
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar88 = *(float *)(prim + uVar86 * 0x19 + 0x12);
  auVar6 = vsubps_avx(auVar6,*(undefined1 (*) [16])(prim + uVar86 * 0x19 + 6));
  auVar90._0_4_ = fVar88 * auVar6._0_4_;
  auVar90._4_4_ = fVar88 * auVar6._4_4_;
  auVar90._8_4_ = fVar88 * auVar6._8_4_;
  auVar90._12_4_ = fVar88 * auVar6._12_4_;
  auVar200._0_4_ = fVar88 * auVar7._0_4_;
  auVar200._4_4_ = fVar88 * auVar7._4_4_;
  auVar200._8_4_ = fVar88 * auVar7._8_4_;
  auVar200._12_4_ = fVar88 * auVar7._12_4_;
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 5 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xc + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xd + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x12 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x13 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x14 + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar275._4_4_ = auVar200._0_4_;
  auVar275._0_4_ = auVar200._0_4_;
  auVar275._8_4_ = auVar200._0_4_;
  auVar275._12_4_ = auVar200._0_4_;
  auVar96 = vshufps_avx(auVar200,auVar200,0x55);
  auVar91 = vshufps_avx(auVar200,auVar200,0xaa);
  fVar88 = auVar91._0_4_;
  auVar256._0_4_ = fVar88 * auVar8._0_4_;
  fVar122 = auVar91._4_4_;
  auVar256._4_4_ = fVar122 * auVar8._4_4_;
  fVar199 = auVar91._8_4_;
  auVar256._8_4_ = fVar199 * auVar8._8_4_;
  fVar215 = auVar91._12_4_;
  auVar256._12_4_ = fVar215 * auVar8._12_4_;
  auVar248._0_4_ = auVar11._0_4_ * fVar88;
  auVar248._4_4_ = auVar11._4_4_ * fVar122;
  auVar248._8_4_ = auVar11._8_4_ * fVar199;
  auVar248._12_4_ = auVar11._12_4_ * fVar215;
  auVar235._0_4_ = auVar143._0_4_ * fVar88;
  auVar235._4_4_ = auVar143._4_4_ * fVar122;
  auVar235._8_4_ = auVar143._8_4_ * fVar199;
  auVar235._12_4_ = auVar143._12_4_ * fVar215;
  auVar91 = vfmadd231ps_fma(auVar256,auVar96,auVar7);
  auVar124 = vfmadd231ps_fma(auVar248,auVar96,auVar10);
  auVar96 = vfmadd231ps_fma(auVar235,auVar92,auVar96);
  auVar164 = vfmadd231ps_fma(auVar91,auVar275,auVar6);
  auVar124 = vfmadd231ps_fma(auVar124,auVar275,auVar9);
  auVar189 = vfmadd231ps_fma(auVar96,auVar93,auVar275);
  auVar276._4_4_ = auVar90._0_4_;
  auVar276._0_4_ = auVar90._0_4_;
  auVar276._8_4_ = auVar90._0_4_;
  auVar276._12_4_ = auVar90._0_4_;
  auVar96 = vshufps_avx(auVar90,auVar90,0x55);
  auVar91 = vshufps_avx(auVar90,auVar90,0xaa);
  fVar88 = auVar91._0_4_;
  auVar201._0_4_ = fVar88 * auVar8._0_4_;
  fVar122 = auVar91._4_4_;
  auVar201._4_4_ = fVar122 * auVar8._4_4_;
  fVar199 = auVar91._8_4_;
  auVar201._8_4_ = fVar199 * auVar8._8_4_;
  fVar215 = auVar91._12_4_;
  auVar201._12_4_ = fVar215 * auVar8._12_4_;
  auVar123._0_4_ = auVar11._0_4_ * fVar88;
  auVar123._4_4_ = auVar11._4_4_ * fVar122;
  auVar123._8_4_ = auVar11._8_4_ * fVar199;
  auVar123._12_4_ = auVar11._12_4_ * fVar215;
  auVar91._0_4_ = auVar143._0_4_ * fVar88;
  auVar91._4_4_ = auVar143._4_4_ * fVar122;
  auVar91._8_4_ = auVar143._8_4_ * fVar199;
  auVar91._12_4_ = auVar143._12_4_ * fVar215;
  auVar7 = vfmadd231ps_fma(auVar201,auVar96,auVar7);
  auVar8 = vfmadd231ps_fma(auVar123,auVar96,auVar10);
  auVar10 = vfmadd231ps_fma(auVar91,auVar96,auVar92);
  auVar11 = vfmadd231ps_fma(auVar7,auVar276,auVar6);
  auVar92 = vfmadd231ps_fma(auVar8,auVar276,auVar9);
  auVar143 = vfmadd231ps_fma(auVar10,auVar276,auVar93);
  auVar242._8_4_ = 0x7fffffff;
  auVar242._0_8_ = 0x7fffffff7fffffff;
  auVar242._12_4_ = 0x7fffffff;
  auVar6 = vandps_avx(auVar164,auVar242);
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  auVar6 = vcmpps_avx(auVar6,auVar188,1);
  auVar7 = vblendvps_avx(auVar164,auVar188,auVar6);
  auVar6 = vandps_avx(auVar124,auVar242);
  auVar6 = vcmpps_avx(auVar6,auVar188,1);
  auVar8 = vblendvps_avx(auVar124,auVar188,auVar6);
  auVar6 = vandps_avx(auVar242,auVar189);
  auVar6 = vcmpps_avx(auVar6,auVar188,1);
  auVar6 = vblendvps_avx(auVar189,auVar188,auVar6);
  auVar9 = vrcpps_avx(auVar7);
  auVar236._8_4_ = 0x3f800000;
  auVar236._0_8_ = 0x3f8000003f800000;
  auVar236._12_4_ = 0x3f800000;
  auVar7 = vfnmadd213ps_fma(auVar7,auVar9,auVar236);
  auVar9 = vfmadd132ps_fma(auVar7,auVar9,auVar9);
  auVar7 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar7,auVar236);
  auVar10 = vfmadd132ps_fma(auVar8,auVar7,auVar7);
  auVar7 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar7,auVar236);
  auVar93 = vfmadd132ps_fma(auVar6,auVar7,auVar7);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar86 * 7 + 6);
  auVar6 = vpmovsxwd_avx(auVar6);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar11);
  auVar189._0_4_ = auVar9._0_4_ * auVar6._0_4_;
  auVar189._4_4_ = auVar9._4_4_ * auVar6._4_4_;
  auVar189._8_4_ = auVar9._8_4_ * auVar6._8_4_;
  auVar189._12_4_ = auVar9._12_4_ * auVar6._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar86 * 9 + 6);
  auVar6 = vpmovsxwd_avx(auVar7);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar11);
  auVar202._0_4_ = auVar9._0_4_ * auVar6._0_4_;
  auVar202._4_4_ = auVar9._4_4_ * auVar6._4_4_;
  auVar202._8_4_ = auVar9._8_4_ * auVar6._8_4_;
  auVar202._12_4_ = auVar9._12_4_ * auVar6._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar86 * 0xe + 6);
  auVar6 = vpmovsxwd_avx(auVar8);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar92);
  auVar222._0_4_ = auVar10._0_4_ * auVar6._0_4_;
  auVar222._4_4_ = auVar10._4_4_ * auVar6._4_4_;
  auVar222._8_4_ = auVar10._8_4_ * auVar6._8_4_;
  auVar222._12_4_ = auVar10._12_4_ * auVar6._12_4_;
  auVar124._1_3_ = 0;
  auVar124[0] = PVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar9);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar92);
  auVar96._0_4_ = auVar10._0_4_ * auVar6._0_4_;
  auVar96._4_4_ = auVar10._4_4_ * auVar6._4_4_;
  auVar96._8_4_ = auVar10._8_4_ * auVar6._8_4_;
  auVar96._12_4_ = auVar10._12_4_ * auVar6._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar86 * 0x15 + 6);
  auVar6 = vpmovsxwd_avx(auVar10);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar143);
  auVar164._0_4_ = auVar93._0_4_ * auVar6._0_4_;
  auVar164._4_4_ = auVar93._4_4_ * auVar6._4_4_;
  auVar164._8_4_ = auVar93._8_4_ * auVar6._8_4_;
  auVar164._12_4_ = auVar93._12_4_ * auVar6._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar86 * 0x17 + 6);
  auVar6 = vpmovsxwd_avx(auVar11);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar6 = vsubps_avx(auVar6,auVar143);
  auVar92._0_4_ = auVar93._0_4_ * auVar6._0_4_;
  auVar92._4_4_ = auVar93._4_4_ * auVar6._4_4_;
  auVar92._8_4_ = auVar93._8_4_ * auVar6._8_4_;
  auVar92._12_4_ = auVar93._12_4_ * auVar6._12_4_;
  auVar6 = vpminsd_avx(auVar189,auVar202);
  auVar7 = vpminsd_avx(auVar222,auVar96);
  auVar6 = vmaxps_avx(auVar6,auVar7);
  auVar7 = vpminsd_avx(auVar164,auVar92);
  uVar85 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar249._4_4_ = uVar85;
  auVar249._0_4_ = uVar85;
  auVar249._8_4_ = uVar85;
  auVar249._12_4_ = uVar85;
  auVar7 = vmaxps_avx(auVar7,auVar249);
  auVar6 = vmaxps_avx(auVar6,auVar7);
  local_7e0._0_4_ = auVar6._0_4_ * 0.99999964;
  local_7e0._4_4_ = auVar6._4_4_ * 0.99999964;
  local_7e0._8_4_ = auVar6._8_4_ * 0.99999964;
  local_7e0._12_4_ = auVar6._12_4_ * 0.99999964;
  auVar6 = vpmaxsd_avx(auVar189,auVar202);
  auVar7 = vpmaxsd_avx(auVar222,auVar96);
  auVar6 = vminps_avx(auVar6,auVar7);
  auVar7 = vpmaxsd_avx(auVar164,auVar92);
  uVar85 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar143._4_4_ = uVar85;
  auVar143._0_4_ = uVar85;
  auVar143._8_4_ = uVar85;
  auVar143._12_4_ = uVar85;
  auVar7 = vminps_avx(auVar7,auVar143);
  auVar6 = vminps_avx(auVar6,auVar7);
  auVar93._0_4_ = auVar6._0_4_ * 1.0000004;
  auVar93._4_4_ = auVar6._4_4_ * 1.0000004;
  auVar93._8_4_ = auVar6._8_4_ * 1.0000004;
  auVar93._12_4_ = auVar6._12_4_ * 1.0000004;
  auVar124[4] = PVar1;
  auVar124._5_3_ = 0;
  auVar124[8] = PVar1;
  auVar124._9_3_ = 0;
  auVar124[0xc] = PVar1;
  auVar124._13_3_ = 0;
  auVar7 = vpcmpgtd_avx(auVar124,_DAT_01f4ad30);
  auVar6 = vcmpps_avx(local_7e0,auVar93,2);
  auVar6 = vandps_avx(auVar6,auVar7);
  uVar85 = vmovmskps_avx(auVar6);
  uVar86 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar85);
  auVar105._16_16_ = mm_lookupmask_ps._240_16_;
  auVar105._0_16_ = mm_lookupmask_ps._240_16_;
  local_740 = vblendps_avx(auVar105,ZEXT832(0) << 0x20,0x80);
  local_aa8 = (undefined1 (*) [32])&local_440;
  iVar78 = 1 << ((uint)k & 0x1f);
  auVar106._4_4_ = iVar78;
  auVar106._0_4_ = iVar78;
  auVar106._8_4_ = iVar78;
  auVar106._12_4_ = iVar78;
  auVar106._16_4_ = iVar78;
  auVar106._20_4_ = iVar78;
  auVar106._24_4_ = iVar78;
  auVar106._28_4_ = iVar78;
  auVar160 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar105 = vpand_avx2(auVar106,auVar160);
  local_7c0 = vpcmpeqd_avx2(auVar105,auVar160);
  local_a08 = prim;
LAB_0116d70d:
  if (uVar86 == 0) {
    return;
  }
  lVar81 = 0;
  for (uVar83 = uVar86; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
    lVar81 = lVar81 + 1;
  }
  uVar80 = *(uint *)(local_a08 + 2);
  local_7a0 = *(uint *)(local_a08 + lVar81 * 4 + 6);
  local_a00 = (ulong)local_7a0;
  pGVar3 = (context->scene->geometries).items[uVar80].ptr;
  uVar83 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_a00);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar81 = *(long *)&pGVar3[1].time_range.upper;
  auVar6 = *(undefined1 (*) [16])(lVar81 + (long)p_Var4 * uVar83);
  auVar7 = *(undefined1 (*) [16])(lVar81 + (uVar83 + 1) * (long)p_Var4);
  uVar86 = uVar86 - 1 & uVar86;
  if (uVar86 != 0) {
    uVar84 = uVar86 - 1 & uVar86;
    for (uVar18 = uVar86; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
    }
    if (uVar84 != 0) {
      for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar9 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar257._4_4_ = uVar85;
  auVar257._0_4_ = uVar85;
  auVar257._8_4_ = uVar85;
  auVar257._12_4_ = uVar85;
  fStack_970 = (float)uVar85;
  _local_980 = auVar257;
  fStack_96c = (float)uVar85;
  fStack_968 = (float)uVar85;
  register0x0000149c = uVar85;
  auVar263 = ZEXT3264(_local_980);
  uVar85 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar265._4_4_ = uVar85;
  auVar265._0_4_ = uVar85;
  auVar265._8_4_ = uVar85;
  auVar265._12_4_ = uVar85;
  fStack_950 = (float)uVar85;
  _local_960 = auVar265;
  fStack_94c = (float)uVar85;
  fStack_948 = (float)uVar85;
  register0x000014dc = uVar85;
  auVar8 = vunpcklps_avx(auVar257,auVar265);
  fVar88 = *(float *)(ray + k * 4 + 0xc0);
  auVar268._4_4_ = fVar88;
  auVar268._0_4_ = fVar88;
  auVar268._8_4_ = fVar88;
  auVar268._12_4_ = fVar88;
  fStack_870 = fVar88;
  _local_880 = auVar268;
  fStack_86c = fVar88;
  fStack_868 = fVar88;
  register0x0000151c = fVar88;
  auVar271 = ZEXT3264(_local_880);
  local_a70 = vinsertps_avx(auVar8,auVar268,0x28);
  auVar244 = ZEXT1664(local_a70);
  auVar203._0_4_ = (auVar6._0_4_ + auVar7._0_4_) * 0.5;
  auVar203._4_4_ = (auVar6._4_4_ + auVar7._4_4_) * 0.5;
  auVar203._8_4_ = (auVar6._8_4_ + auVar7._8_4_) * 0.5;
  auVar203._12_4_ = (auVar6._12_4_ + auVar7._12_4_) * 0.5;
  auVar8 = vsubps_avx(auVar203,auVar9);
  auVar8 = vdpps_avx(auVar8,local_a70,0x7f);
  local_a80 = vdpps_avx(local_a70,local_a70,0x7f);
  auVar10 = vrcpss_avx(local_a80,local_a80);
  auVar11 = vfnmadd213ss_fma(auVar10,local_a80,ZEXT416(0x40000000));
  local_360 = auVar8._0_4_ * auVar10._0_4_ * auVar11._0_4_;
  auVar223._4_4_ = local_360;
  auVar223._0_4_ = local_360;
  auVar223._8_4_ = local_360;
  auVar223._12_4_ = local_360;
  fStack_a50 = local_360;
  _local_a60 = auVar223;
  fStack_a4c = local_360;
  fStack_a48 = local_360;
  fStack_a44 = local_360;
  auVar8 = vfmadd231ps_fma(auVar9,local_a70,auVar223);
  auVar8 = vblendps_avx(auVar8,_DAT_01f45a50,8);
  auVar9 = vsubps_avx(auVar6,auVar8);
  auVar228 = ZEXT1664(auVar9);
  auVar10 = vsubps_avx(*(undefined1 (*) [16])(lVar81 + (uVar83 + 2) * (long)p_Var4),auVar8);
  auVar11 = vsubps_avx(auVar7,auVar8);
  auVar8 = vsubps_avx(*(undefined1 (*) [16])(lVar81 + (uVar83 + 3) * (long)p_Var4),auVar8);
  auVar6 = vmovshdup_avx(auVar9);
  local_1e0 = auVar6._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar6 = vshufps_avx(auVar9,auVar9,0xaa);
  local_200 = auVar6._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar6 = vshufps_avx(auVar9,auVar9,0xff);
  local_5c0 = auVar6._0_8_;
  auVar6 = vmovshdup_avx(auVar11);
  local_220 = auVar6._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar6 = vshufps_avx(auVar11,auVar11,0xaa);
  local_5e0 = auVar6._0_8_;
  auVar6 = vshufps_avx(auVar11,auVar11,0xff);
  local_600 = auVar6._0_8_;
  auVar6 = vmovshdup_avx(auVar10);
  local_620 = auVar6._0_8_;
  auVar6 = vshufps_avx(auVar10,auVar10,0xaa);
  local_640 = auVar6._0_8_;
  auVar6 = vshufps_avx(auVar10,auVar10,0xff);
  local_660 = auVar6._0_8_;
  auVar6 = vmovshdup_avx(auVar8);
  local_680 = auVar6._0_8_;
  auVar6 = vshufps_avx(auVar8,auVar8,0xaa);
  uVar89 = auVar6._0_8_;
  local_720._8_8_ = uVar89;
  local_720._0_8_ = uVar89;
  local_720._16_8_ = uVar89;
  local_720._24_8_ = uVar89;
  auVar6 = vshufps_avx(auVar8,auVar8,0xff);
  local_6a0 = auVar6._0_8_;
  auVar6 = vfmadd231ps_fma(ZEXT432((uint)(fVar88 * fVar88)),_local_960,_local_960);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),_local_980,_local_980);
  uVar85 = auVar6._0_4_;
  local_240._4_4_ = uVar85;
  local_240._0_4_ = uVar85;
  local_240._8_4_ = uVar85;
  local_240._12_4_ = uVar85;
  local_240._16_4_ = uVar85;
  local_240._20_4_ = uVar85;
  local_240._24_4_ = uVar85;
  local_240._28_4_ = uVar85;
  auVar240 = ZEXT3264(local_240);
  fVar88 = *(float *)(ray + k * 4 + 0x60);
  local_a20 = ZEXT416((uint)local_360);
  local_360 = fVar88 - local_360;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  uVar83 = 0;
  local_cc4 = 1;
  local_6c0 = auVar9._0_4_;
  local_6e0 = auVar11._0_4_;
  local_700 = auVar10._0_4_;
  fVar122 = auVar8._0_4_;
  local_260 = fVar122;
  fStack_25c = fVar122;
  fStack_258 = fVar122;
  fStack_254 = fVar122;
  fStack_250 = fVar122;
  fStack_24c = fVar122;
  fStack_248 = fVar122;
  fStack_244 = fVar122;
  local_8c0._8_4_ = 0x7fffffff;
  local_8c0._0_8_ = 0x7fffffff7fffffff;
  local_8c0._12_4_ = 0x7fffffff;
  local_8c0._16_4_ = 0x7fffffff;
  local_8c0._20_4_ = 0x7fffffff;
  local_8c0._24_4_ = 0x7fffffff;
  local_8c0._28_4_ = 0x7fffffff;
  local_760 = vandps_avx(local_240,local_8c0);
  auVar6 = vsqrtss_avx(local_a80,local_a80);
  auVar7 = vsqrtss_avx(local_a80,local_a80);
  auVar142 = ZEXT1664(ZEXT816(0x3f80000000000000));
  uStack_79c = local_7a0;
  uStack_798 = local_7a0;
  uStack_794 = local_7a0;
  uStack_790 = local_7a0;
  uStack_78c = local_7a0;
  uStack_788 = local_7a0;
  uStack_784 = local_7a0;
  local_780 = uVar80;
  uStack_77c = uVar80;
  uStack_778 = uVar80;
  uStack_774 = uVar80;
  uStack_770 = uVar80;
  uStack_76c = uVar80;
  uStack_768 = uVar80;
  uStack_764 = uVar80;
  uStack_6fc = local_700;
  uStack_6f8 = local_700;
  uStack_6f4 = local_700;
  uStack_6f0 = local_700;
  uStack_6ec = local_700;
  uStack_6e8 = local_700;
  uStack_6e4 = local_700;
  uStack_6dc = local_6e0;
  uStack_6d8 = local_6e0;
  uStack_6d4 = local_6e0;
  uStack_6d0 = local_6e0;
  uStack_6cc = local_6e0;
  uStack_6c8 = local_6e0;
  uStack_6c4 = local_6e0;
  uStack_6bc = local_6c0;
  uStack_6b8 = local_6c0;
  uStack_6b4 = local_6c0;
  uStack_6b0 = local_6c0;
  uStack_6ac = local_6c0;
  uStack_6a8 = local_6c0;
  uStack_6a4 = local_6c0;
  uStack_698 = local_6a0;
  uStack_690 = local_6a0;
  uStack_688 = local_6a0;
  uStack_678 = local_680;
  uStack_670 = local_680;
  uStack_668 = local_680;
  uStack_658 = local_660;
  uStack_650 = local_660;
  uStack_648 = local_660;
  uStack_638 = local_640;
  uStack_630 = local_640;
  uStack_628 = local_640;
  uStack_618 = local_620;
  uStack_610 = local_620;
  uStack_608 = local_620;
  uStack_5f8 = local_600;
  uStack_5f0 = local_600;
  uStack_5e8 = local_600;
  uStack_5d8 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5c8 = local_5e0;
  uStack_5b8 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5a8 = local_5c0;
  do {
    local_7d0 = auVar142._0_16_;
    auVar93 = vmovshdup_avx(local_7d0);
    auVar93 = vsubps_avx(auVar93,local_7d0);
    local_940._0_4_ = auVar93._0_4_;
    fVar163 = local_940._0_4_ * 0.04761905;
    uVar85 = auVar142._0_4_;
    local_920._4_4_ = uVar85;
    local_920._0_4_ = uVar85;
    local_920._8_4_ = uVar85;
    local_920._12_4_ = uVar85;
    local_920._16_4_ = uVar85;
    local_920._20_4_ = uVar85;
    local_920._24_4_ = uVar85;
    local_920._28_4_ = uVar85;
    local_940._4_4_ = local_940._0_4_;
    local_940._8_4_ = local_940._0_4_;
    local_940._12_4_ = local_940._0_4_;
    local_940._16_4_ = local_940._0_4_;
    local_940._20_4_ = local_940._0_4_;
    local_940._24_4_ = local_940._0_4_;
    local_940._28_4_ = local_940._0_4_;
    auVar93 = vfmadd231ps_fma(local_920,local_940,_DAT_01f7b040);
    auVar107._8_4_ = 0x3f800000;
    auVar107._0_8_ = 0x3f8000003f800000;
    auVar107._12_4_ = 0x3f800000;
    auVar107._16_4_ = 0x3f800000;
    auVar107._20_4_ = 0x3f800000;
    auVar107._24_4_ = 0x3f800000;
    auVar107._28_4_ = 0x3f800000;
    auVar105 = vsubps_avx(auVar107,ZEXT1632(auVar93));
    fVar199 = auVar93._0_4_;
    fVar216 = auVar93._4_4_;
    fVar218 = auVar93._8_4_;
    fVar220 = auVar93._12_4_;
    auVar142._28_36_ = auVar240._28_36_;
    auVar142._0_28_ =
         ZEXT1628(CONCAT412(fVar220 * fVar220,
                            CONCAT48(fVar218 * fVar218,CONCAT44(fVar216 * fVar216,fVar199 * fVar199)
                                    )));
    fVar241 = fVar199 * 3.0;
    fVar245 = fVar216 * 3.0;
    fVar246 = fVar218 * 3.0;
    fVar247 = fVar220 * 3.0;
    fVar215 = auVar105._0_4_;
    auVar264._0_4_ = fVar215 * fVar215;
    fVar217 = auVar105._4_4_;
    auVar264._4_4_ = fVar217 * fVar217;
    fVar219 = auVar105._8_4_;
    auVar264._8_4_ = fVar219 * fVar219;
    fVar184 = auVar105._12_4_;
    auVar264._12_4_ = fVar184 * fVar184;
    fVar185 = auVar105._16_4_;
    auVar264._16_4_ = fVar185 * fVar185;
    fVar186 = auVar105._20_4_;
    auVar264._20_4_ = fVar186 * fVar186;
    fVar187 = auVar105._24_4_;
    auVar264._28_36_ = auVar263._28_36_;
    auVar264._24_4_ = fVar187 * fVar187;
    auVar263._0_4_ = (auVar264._0_4_ * (fVar215 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263._4_4_ = (auVar264._4_4_ * (fVar217 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263._8_4_ = (auVar264._8_4_ * (fVar219 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263._12_4_ = (auVar264._12_4_ * (fVar184 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263._16_4_ = (auVar264._16_4_ * (fVar185 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263._20_4_ = (auVar264._20_4_ * (fVar186 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263._28_36_ = auVar271._28_36_;
    auVar263._24_4_ = (auVar264._24_4_ * (fVar187 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar106 = auVar263._0_32_;
    fVar221 = fVar199 * fVar199 * -fVar215 * 0.5;
    fVar229 = fVar216 * fVar216 * -fVar217 * 0.5;
    fVar230 = fVar218 * fVar218 * -fVar219 * 0.5;
    fVar231 = fVar220 * fVar220 * -fVar184 * 0.5;
    fVar232 = -fVar185 * 0.0 * 0.0 * 0.5;
    fVar233 = -fVar186 * 0.0 * 0.0 * 0.5;
    fVar234 = -fVar187 * 0.0 * 0.0 * 0.5;
    auVar160._4_4_ = fStack_25c * fVar229;
    auVar160._0_4_ = local_260 * fVar221;
    auVar160._8_4_ = fStack_258 * fVar230;
    auVar160._12_4_ = fStack_254 * fVar231;
    auVar160._16_4_ = fStack_250 * fVar232;
    auVar160._20_4_ = fStack_24c * fVar233;
    auVar160._24_4_ = fStack_248 * fVar234;
    auVar160._28_4_ = 0x40000000;
    auVar13._4_4_ = fVar229 * local_680._4_4_;
    auVar13._0_4_ = fVar221 * (float)local_680;
    auVar13._8_4_ = fVar230 * (float)uStack_678;
    auVar13._12_4_ = fVar231 * uStack_678._4_4_;
    auVar13._16_4_ = fVar232 * (float)uStack_670;
    auVar13._20_4_ = fVar233 * uStack_670._4_4_;
    auVar13._24_4_ = fVar234 * (float)uStack_668;
    auVar13._28_4_ = auVar105._28_4_ ^ 0x80000000;
    auVar212._4_4_ = local_720._4_4_ * fVar229;
    auVar212._0_4_ = local_720._0_4_ * fVar221;
    auVar212._8_4_ = local_720._8_4_ * fVar230;
    auVar212._12_4_ = local_720._12_4_ * fVar231;
    auVar212._16_4_ = local_720._16_4_ * fVar232;
    auVar212._20_4_ = local_720._20_4_ * fVar233;
    auVar212._24_4_ = local_720._24_4_ * fVar234;
    auVar212._28_4_ = local_720._28_4_;
    auVar114._4_4_ = fVar229 * local_6a0._4_4_;
    auVar114._0_4_ = fVar221 * (float)local_6a0;
    auVar114._8_4_ = fVar230 * (float)uStack_698;
    auVar114._12_4_ = fVar231 * uStack_698._4_4_;
    auVar114._16_4_ = fVar232 * (float)uStack_690;
    auVar114._20_4_ = fVar233 * uStack_690._4_4_;
    auVar114._24_4_ = fVar234 * (float)uStack_688;
    auVar114._28_4_ = auVar228._28_4_;
    auVar54._4_4_ = uStack_6fc;
    auVar54._0_4_ = local_700;
    auVar54._8_4_ = uStack_6f8;
    auVar54._12_4_ = uStack_6f4;
    auVar54._16_4_ = uStack_6f0;
    auVar54._20_4_ = uStack_6ec;
    auVar54._24_4_ = uStack_6e8;
    auVar54._28_4_ = uStack_6e4;
    auVar93 = vfmadd231ps_fma(auVar160,auVar106,auVar54);
    auVar64._8_8_ = uStack_618;
    auVar64._0_8_ = local_620;
    auVar64._16_8_ = uStack_610;
    auVar64._24_8_ = uStack_608;
    auVar92 = vfmadd231ps_fma(auVar13,auVar106,auVar64);
    auVar62._8_8_ = uStack_638;
    auVar62._0_8_ = local_640;
    auVar62._16_8_ = uStack_630;
    auVar62._24_8_ = uStack_628;
    auVar143 = vfmadd231ps_fma(auVar212,auVar106,auVar62);
    auVar60._8_8_ = uStack_658;
    auVar60._0_8_ = local_660;
    auVar60._16_8_ = uStack_650;
    auVar60._24_8_ = uStack_648;
    auVar96 = vfmadd231ps_fma(auVar114,auVar106,auVar60);
    auVar134._4_4_ = ((fVar245 + -5.0) * fVar216 * fVar216 + 2.0) * 0.5;
    auVar134._0_4_ = ((fVar241 + -5.0) * fVar199 * fVar199 + 2.0) * 0.5;
    auVar134._8_4_ = ((fVar246 + -5.0) * fVar218 * fVar218 + 2.0) * 0.5;
    auVar134._12_4_ = ((fVar247 + -5.0) * fVar220 * fVar220 + 2.0) * 0.5;
    auVar134._16_4_ = 0x3f800000;
    auVar134._20_4_ = 0x3f800000;
    auVar134._24_4_ = 0x3f800000;
    auVar134._28_4_ = auVar271._28_4_ + 2.0;
    auVar56._4_4_ = uStack_6dc;
    auVar56._0_4_ = local_6e0;
    auVar56._8_4_ = uStack_6d8;
    auVar56._12_4_ = uStack_6d4;
    auVar56._16_4_ = uStack_6d0;
    auVar56._20_4_ = uStack_6cc;
    auVar56._24_4_ = uStack_6c8;
    auVar56._28_4_ = uStack_6c4;
    auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar134,auVar56);
    auVar75._8_8_ = uStack_218;
    auVar75._0_8_ = local_220;
    auVar75._16_8_ = uStack_210;
    auVar75._24_8_ = uStack_208;
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar134,auVar75);
    auVar68._8_8_ = uStack_5d8;
    auVar68._0_8_ = local_5e0;
    auVar68._16_8_ = uStack_5d0;
    auVar68._24_8_ = uStack_5c8;
    auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar134,auVar68);
    auVar66._8_8_ = uStack_5f8;
    auVar66._0_8_ = local_600;
    auVar66._16_8_ = uStack_5f0;
    auVar66._24_8_ = uStack_5e8;
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar134,auVar66);
    local_b20._8_4_ = 0x80000000;
    local_b20._0_8_ = 0x8000000080000000;
    local_b20._12_4_ = 0x80000000;
    uStack_b10 = 0x80000000;
    uStack_b0c = 0x80000000;
    uStack_b08 = 0x80000000;
    uStack_b04 = 0x80000000;
    auVar211._4_4_ = -fVar216 * fVar217 * fVar217 * 0.5;
    auVar211._0_4_ = -fVar199 * fVar215 * fVar215 * 0.5;
    auVar211._8_4_ = -fVar218 * fVar219 * fVar219 * 0.5;
    auVar211._12_4_ = -fVar220 * fVar184 * fVar184 * 0.5;
    auVar211._16_4_ = fVar185 * -0.0 * fVar185 * 0.5;
    auVar211._20_4_ = fVar186 * -0.0 * fVar186 * 0.5;
    auVar211._24_4_ = fVar187 * -0.0 * fVar187 * 0.5;
    auVar211._28_4_ = 0x80000000;
    auVar58._4_4_ = uStack_6bc;
    auVar58._0_4_ = local_6c0;
    auVar58._8_4_ = uStack_6b8;
    auVar58._12_4_ = uStack_6b4;
    auVar58._16_4_ = uStack_6b0;
    auVar58._20_4_ = uStack_6ac;
    auVar58._24_4_ = uStack_6a8;
    auVar58._28_4_ = uStack_6a4;
    auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar211,auVar58);
    auVar77._8_8_ = uStack_1d8;
    auVar77._0_8_ = local_1e0;
    auVar77._16_8_ = uStack_1d0;
    auVar77._24_8_ = uStack_1c8;
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar211,auVar77);
    auVar76._8_8_ = uStack_1f8;
    auVar76._0_8_ = local_200;
    auVar76._16_8_ = uStack_1f0;
    auVar76._24_8_ = uStack_1e8;
    auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar211,auVar76);
    auVar70._8_8_ = uStack_5b8;
    auVar70._0_8_ = local_5c0;
    auVar70._16_8_ = uStack_5b0;
    auVar70._24_8_ = uStack_5a8;
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar211,auVar70);
    auVar206._0_4_ = (fVar215 + fVar215) * fVar199;
    auVar206._4_4_ = (fVar217 + fVar217) * fVar216;
    auVar206._8_4_ = (fVar219 + fVar219) * fVar218;
    auVar206._12_4_ = (fVar184 + fVar184) * fVar220;
    auVar206._16_4_ = (fVar185 + fVar185) * 0.0;
    auVar206._20_4_ = (fVar186 + fVar186) * 0.0;
    auVar206._24_4_ = (fVar187 + fVar187) * 0.0;
    auVar206._28_4_ = 0;
    auVar160 = vsubps_avx(auVar206,auVar264._0_32_);
    fVar221 = auVar244._28_4_ + 2.0;
    auVar179._4_4_ = (fVar217 + fVar217) * (fVar245 + 2.0);
    auVar179._0_4_ = (fVar215 + fVar215) * (fVar241 + 2.0);
    auVar179._8_4_ = (fVar219 + fVar219) * (fVar246 + 2.0);
    auVar179._12_4_ = (fVar184 + fVar184) * (fVar247 + 2.0);
    auVar179._16_4_ = (fVar185 + fVar185) * 2.0;
    auVar179._20_4_ = (fVar186 + fVar186) * 2.0;
    auVar179._24_4_ = (fVar187 + fVar187) * 2.0;
    auVar179._28_4_ = fVar221;
    auVar14._4_4_ = fVar217 * fVar217 * 3.0;
    auVar14._0_4_ = fVar215 * fVar215 * 3.0;
    auVar14._8_4_ = fVar219 * fVar219 * 3.0;
    auVar14._12_4_ = fVar184 * fVar184 * 3.0;
    auVar14._16_4_ = fVar185 * fVar185 * 3.0;
    auVar14._20_4_ = fVar186 * fVar186 * 3.0;
    auVar14._24_4_ = fVar187 * fVar187 * 3.0;
    auVar14._28_4_ = auVar105._28_4_;
    auVar105 = vsubps_avx(auVar179,auVar14);
    auVar106 = vsubps_avx(auVar142._0_32_,auVar206);
    auVar15._4_4_ = auVar160._4_4_ * 0.5;
    auVar15._0_4_ = auVar160._0_4_ * 0.5;
    auVar15._8_4_ = auVar160._8_4_ * 0.5;
    auVar15._12_4_ = auVar160._12_4_ * 0.5;
    auVar15._16_4_ = auVar160._16_4_ * 0.5;
    auVar15._20_4_ = auVar160._20_4_ * 0.5;
    auVar15._24_4_ = auVar160._24_4_ * 0.5;
    auVar15._28_4_ = auVar240._28_4_;
    auVar16._28_4_ = fVar221;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412((fVar247 * fVar220 + (fVar220 + fVar220) * (fVar247 + -5.0)) * 0.5,
                            CONCAT48((fVar246 * fVar218 + (fVar218 + fVar218) * (fVar246 + -5.0)) *
                                     0.5,CONCAT44((fVar245 * fVar216 +
                                                  (fVar216 + fVar216) * (fVar245 + -5.0)) * 0.5,
                                                  (fVar241 * fVar199 +
                                                  (fVar199 + fVar199) * (fVar241 + -5.0)) * 0.5))));
    auVar17._4_4_ = auVar105._4_4_ * 0.5;
    auVar17._0_4_ = auVar105._0_4_ * 0.5;
    auVar17._8_4_ = auVar105._8_4_ * 0.5;
    auVar17._12_4_ = auVar105._12_4_ * 0.5;
    auVar17._16_4_ = auVar105._16_4_ * 0.5;
    auVar17._20_4_ = auVar105._20_4_ * 0.5;
    auVar17._24_4_ = auVar105._24_4_ * 0.5;
    auVar17._28_4_ = auVar105._28_4_;
    fVar199 = auVar106._0_4_ * 0.5;
    fVar215 = auVar106._4_4_ * 0.5;
    fVar216 = auVar106._8_4_ * 0.5;
    fVar217 = auVar106._12_4_ * 0.5;
    fVar218 = auVar106._16_4_ * 0.5;
    fVar219 = auVar106._20_4_ * 0.5;
    fVar220 = auVar106._24_4_ * 0.5;
    auVar210._4_4_ = fStack_25c * fVar215;
    auVar210._0_4_ = local_260 * fVar199;
    auVar210._8_4_ = fStack_258 * fVar216;
    auVar210._12_4_ = fStack_254 * fVar217;
    auVar210._16_4_ = fStack_250 * fVar218;
    auVar210._20_4_ = fStack_24c * fVar219;
    auVar210._24_4_ = fStack_248 * fVar220;
    auVar210._28_4_ = fStack_244;
    auVar224._4_4_ = fVar215 * local_680._4_4_;
    auVar224._0_4_ = fVar199 * (float)local_680;
    auVar224._8_4_ = fVar216 * (float)uStack_678;
    auVar224._12_4_ = fVar217 * uStack_678._4_4_;
    auVar224._16_4_ = fVar218 * (float)uStack_670;
    auVar224._20_4_ = fVar219 * uStack_670._4_4_;
    auVar224._24_4_ = fVar220 * (float)uStack_668;
    auVar224._28_4_ = auVar160._28_4_;
    auVar269._4_4_ = fVar215 * local_720._4_4_;
    auVar269._0_4_ = fVar199 * local_720._0_4_;
    auVar269._8_4_ = fVar216 * local_720._8_4_;
    auVar269._12_4_ = fVar217 * local_720._12_4_;
    auVar269._16_4_ = fVar218 * local_720._16_4_;
    auVar269._20_4_ = fVar219 * local_720._20_4_;
    auVar269._24_4_ = fVar220 * local_720._24_4_;
    auVar269._28_4_ = auVar244._28_4_ + -5.0 + 0.0;
    auVar272._4_4_ = fVar215 * local_6a0._4_4_;
    auVar272._0_4_ = fVar199 * (float)local_6a0;
    auVar272._8_4_ = fVar216 * (float)uStack_698;
    auVar272._12_4_ = fVar217 * uStack_698._4_4_;
    auVar272._16_4_ = fVar218 * (float)uStack_690;
    auVar272._20_4_ = fVar219 * uStack_690._4_4_;
    auVar272._24_4_ = fVar220 * (float)uStack_688;
    auVar272._28_4_ = auVar106._28_4_;
    auVar55._4_4_ = uStack_6fc;
    auVar55._0_4_ = local_700;
    auVar55._8_4_ = uStack_6f8;
    auVar55._12_4_ = uStack_6f4;
    auVar55._16_4_ = uStack_6f0;
    auVar55._20_4_ = uStack_6ec;
    auVar55._24_4_ = uStack_6e8;
    auVar55._28_4_ = uStack_6e4;
    auVar91 = vfmadd231ps_fma(auVar210,auVar17,auVar55);
    auVar65._8_8_ = uStack_618;
    auVar65._0_8_ = local_620;
    auVar65._16_8_ = uStack_610;
    auVar65._24_8_ = uStack_608;
    auVar124 = vfmadd231ps_fma(auVar224,auVar17,auVar65);
    auVar63._8_8_ = uStack_638;
    auVar63._0_8_ = local_640;
    auVar63._16_8_ = uStack_630;
    auVar63._24_8_ = uStack_628;
    auVar164 = vfmadd231ps_fma(auVar269,auVar17,auVar63);
    auVar61._8_8_ = uStack_658;
    auVar61._0_8_ = local_660;
    auVar61._16_8_ = uStack_650;
    auVar61._24_8_ = uStack_648;
    auVar189 = vfmadd231ps_fma(auVar272,auVar17,auVar61);
    auVar57._4_4_ = uStack_6dc;
    auVar57._0_4_ = local_6e0;
    auVar57._8_4_ = uStack_6d8;
    auVar57._12_4_ = uStack_6d4;
    auVar57._16_4_ = uStack_6d0;
    auVar57._20_4_ = uStack_6cc;
    auVar57._24_4_ = uStack_6c8;
    auVar57._28_4_ = uStack_6c4;
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar16,auVar57);
    auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar16,auVar75);
    auVar69._8_8_ = uStack_5d8;
    auVar69._0_8_ = local_5e0;
    auVar69._16_8_ = uStack_5d0;
    auVar69._24_8_ = uStack_5c8;
    auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar16,auVar69);
    auVar67._8_8_ = uStack_5f8;
    auVar67._0_8_ = local_600;
    auVar67._16_8_ = uStack_5f0;
    auVar67._24_8_ = uStack_5e8;
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar16,auVar67);
    auVar59._4_4_ = uStack_6bc;
    auVar59._0_4_ = local_6c0;
    auVar59._8_4_ = uStack_6b8;
    auVar59._12_4_ = uStack_6b4;
    auVar59._16_4_ = uStack_6b0;
    auVar59._20_4_ = uStack_6ac;
    auVar59._24_4_ = uStack_6a8;
    auVar59._28_4_ = uStack_6a4;
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar15,auVar59);
    auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar15,auVar77);
    auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar15,auVar76);
    auVar71._8_8_ = uStack_5b8;
    auVar71._0_8_ = local_5c0;
    auVar71._16_8_ = uStack_5b0;
    auVar71._24_8_ = uStack_5a8;
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar15,auVar71);
    local_b00._0_4_ = auVar91._0_4_ * fVar163;
    local_b00._4_4_ = auVar91._4_4_ * fVar163;
    local_b00._8_4_ = auVar91._8_4_ * fVar163;
    local_b00._12_4_ = auVar91._12_4_ * fVar163;
    local_b00._16_4_ = fVar163 * 0.0;
    local_b00._20_4_ = fVar163 * 0.0;
    local_b00._24_4_ = fVar163 * 0.0;
    local_b00._28_4_ = 0;
    auVar260._0_4_ = auVar124._0_4_ * fVar163;
    auVar260._4_4_ = auVar124._4_4_ * fVar163;
    auVar260._8_4_ = auVar124._8_4_ * fVar163;
    auVar260._12_4_ = auVar124._12_4_ * fVar163;
    auVar260._16_4_ = fVar163 * 0.0;
    auVar260._20_4_ = fVar163 * 0.0;
    auVar260._24_4_ = fVar163 * 0.0;
    auVar260._28_4_ = 0;
    local_900._0_4_ = auVar164._0_4_ * fVar163;
    local_900._4_4_ = auVar164._4_4_ * fVar163;
    local_900._8_4_ = auVar164._8_4_ * fVar163;
    local_900._12_4_ = auVar164._12_4_ * fVar163;
    local_900._16_4_ = fVar163 * 0.0;
    local_900._20_4_ = fVar163 * 0.0;
    local_900._24_4_ = fVar163 * 0.0;
    local_900._28_4_ = 0;
    fVar199 = fVar163 * auVar189._0_4_;
    fVar215 = fVar163 * auVar189._4_4_;
    auVar277._4_4_ = fVar215;
    auVar277._0_4_ = fVar199;
    fVar216 = fVar163 * auVar189._8_4_;
    auVar277._8_4_ = fVar216;
    fVar217 = fVar163 * auVar189._12_4_;
    auVar277._12_4_ = fVar217;
    auVar277._16_4_ = fVar163 * 0.0;
    auVar277._20_4_ = fVar163 * 0.0;
    auVar277._24_4_ = fVar163 * 0.0;
    auVar277._28_4_ = fVar163;
    auVar272 = ZEXT1632(auVar93);
    local_ae0 = vpermps_avx2(_DAT_01fb7720,auVar272);
    _local_aa0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar143));
    local_2e0 = vsubps_avx(local_ae0,ZEXT1632(auVar93));
    local_2c0 = vsubps_avx(_local_aa0,ZEXT1632(auVar143));
    fVar184 = local_2c0._0_4_;
    fVar185 = local_2c0._4_4_;
    auVar12._4_4_ = fVar185 * local_b00._4_4_;
    auVar12._0_4_ = fVar184 * (float)local_b00._0_4_;
    fVar186 = local_2c0._8_4_;
    auVar12._8_4_ = fVar186 * local_b00._8_4_;
    fVar187 = local_2c0._12_4_;
    auVar12._12_4_ = fVar187 * local_b00._12_4_;
    fVar232 = local_2c0._16_4_;
    auVar12._16_4_ = fVar232 * local_b00._16_4_;
    fVar233 = local_2c0._20_4_;
    auVar12._20_4_ = fVar233 * local_b00._20_4_;
    fVar234 = local_2c0._24_4_;
    auVar12._24_4_ = fVar234 * local_b00._24_4_;
    auVar12._28_4_ = local_aa0._28_4_;
    auVar93 = vfmsub231ps_fma(auVar12,local_900,local_2e0);
    local_8e0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar92));
    local_300 = vsubps_avx(local_8e0,ZEXT1632(auVar92));
    fVar241 = local_2e0._0_4_;
    fVar245 = local_2e0._4_4_;
    auVar19._4_4_ = fVar245 * auVar260._4_4_;
    auVar19._0_4_ = fVar241 * auVar260._0_4_;
    fVar246 = local_2e0._8_4_;
    auVar19._8_4_ = fVar246 * auVar260._8_4_;
    fVar247 = local_2e0._12_4_;
    auVar19._12_4_ = fVar247 * auVar260._12_4_;
    fVar289 = local_2e0._16_4_;
    auVar19._16_4_ = fVar289 * auVar260._16_4_;
    fVar273 = local_2e0._20_4_;
    auVar19._20_4_ = fVar273 * auVar260._20_4_;
    fVar274 = local_2e0._24_4_;
    auVar19._24_4_ = fVar274 * auVar260._24_4_;
    auVar19._28_4_ = local_8e0._28_4_;
    auVar91 = vfmsub231ps_fma(auVar19,local_b00,local_300);
    auVar93 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar91._12_4_ * auVar91._12_4_,
                                                 CONCAT48(auVar91._8_4_ * auVar91._8_4_,
                                                          CONCAT44(auVar91._4_4_ * auVar91._4_4_,
                                                                   auVar91._0_4_ * auVar91._0_4_))))
                              ,ZEXT1632(auVar93),ZEXT1632(auVar93));
    fVar221 = local_300._0_4_;
    auVar207._0_4_ = fVar221 * (float)local_900._0_4_;
    fVar229 = local_300._4_4_;
    auVar207._4_4_ = fVar229 * local_900._4_4_;
    fVar230 = local_300._8_4_;
    auVar207._8_4_ = fVar230 * local_900._8_4_;
    fVar231 = local_300._12_4_;
    auVar207._12_4_ = fVar231 * local_900._12_4_;
    fVar281 = local_300._16_4_;
    auVar207._16_4_ = fVar281 * local_900._16_4_;
    fVar282 = local_300._20_4_;
    auVar207._20_4_ = fVar282 * local_900._20_4_;
    fVar283 = local_300._24_4_;
    auVar207._24_4_ = fVar283 * local_900._24_4_;
    auVar207._28_4_ = 0;
    auVar91 = vfmsub231ps_fma(auVar207,auVar260,local_2c0);
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar93),ZEXT1632(auVar91),ZEXT1632(auVar91));
    auVar208._0_4_ = fVar184 * fVar184;
    auVar208._4_4_ = fVar185 * fVar185;
    auVar208._8_4_ = fVar186 * fVar186;
    auVar208._12_4_ = fVar187 * fVar187;
    auVar208._16_4_ = fVar232 * fVar232;
    auVar208._20_4_ = fVar233 * fVar233;
    auVar208._24_4_ = fVar234 * fVar234;
    auVar208._28_4_ = 0;
    auVar93 = vfmadd231ps_fma(auVar208,local_300,local_300);
    auVar124 = vfmadd231ps_fma(ZEXT1632(auVar93),local_2e0,local_2e0);
    auVar105 = vrcpps_avx(ZEXT1632(auVar124));
    auVar108._8_4_ = 0x3f800000;
    auVar108._0_8_ = 0x3f8000003f800000;
    auVar108._12_4_ = 0x3f800000;
    auVar108._16_4_ = 0x3f800000;
    auVar108._20_4_ = 0x3f800000;
    auVar108._24_4_ = 0x3f800000;
    auVar108._28_4_ = 0x3f800000;
    auVar93 = vfnmadd213ps_fma(auVar105,ZEXT1632(auVar124),auVar108);
    auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar105,auVar105);
    auVar179 = vpermps_avx2(_DAT_01fb7720,local_b00);
    auVar14 = vpermps_avx2(_DAT_01fb7720,local_900);
    auVar20._4_4_ = fVar185 * auVar179._4_4_;
    auVar20._0_4_ = fVar184 * auVar179._0_4_;
    auVar20._8_4_ = fVar186 * auVar179._8_4_;
    auVar20._12_4_ = fVar187 * auVar179._12_4_;
    auVar20._16_4_ = fVar232 * auVar179._16_4_;
    auVar20._20_4_ = fVar233 * auVar179._20_4_;
    auVar20._24_4_ = fVar234 * auVar179._24_4_;
    auVar20._28_4_ = auVar105._28_4_;
    auVar164 = vfmsub231ps_fma(auVar20,auVar14,local_2e0);
    auVar15 = vpermps_avx2(_DAT_01fb7720,auVar260);
    auVar21._4_4_ = fVar245 * auVar15._4_4_;
    auVar21._0_4_ = fVar241 * auVar15._0_4_;
    auVar21._8_4_ = fVar246 * auVar15._8_4_;
    auVar21._12_4_ = fVar247 * auVar15._12_4_;
    auVar21._16_4_ = fVar289 * auVar15._16_4_;
    auVar21._20_4_ = fVar273 * auVar15._20_4_;
    auVar21._24_4_ = fVar274 * auVar15._24_4_;
    auVar21._28_4_ = 0;
    auVar189 = vfmsub231ps_fma(auVar21,auVar179,local_300);
    auVar164 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar189._12_4_ * auVar189._12_4_,
                                                  CONCAT48(auVar189._8_4_ * auVar189._8_4_,
                                                           CONCAT44(auVar189._4_4_ * auVar189._4_4_,
                                                                    auVar189._0_4_ * auVar189._0_4_)
                                                          ))),ZEXT1632(auVar164),ZEXT1632(auVar164))
    ;
    auVar239._0_4_ = fVar221 * auVar14._0_4_;
    auVar239._4_4_ = fVar229 * auVar14._4_4_;
    auVar239._8_4_ = fVar230 * auVar14._8_4_;
    auVar239._12_4_ = fVar231 * auVar14._12_4_;
    auVar239._16_4_ = fVar281 * auVar14._16_4_;
    auVar239._20_4_ = fVar282 * auVar14._20_4_;
    auVar239._24_4_ = fVar283 * auVar14._24_4_;
    auVar239._28_4_ = 0;
    auVar189 = vfmsub231ps_fma(auVar239,auVar15,local_2c0);
    auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),ZEXT1632(auVar189),ZEXT1632(auVar189));
    auVar105 = vmaxps_avx(ZEXT1632(CONCAT412(auVar93._12_4_ * auVar91._12_4_,
                                             CONCAT48(auVar93._8_4_ * auVar91._8_4_,
                                                      CONCAT44(auVar93._4_4_ * auVar91._4_4_,
                                                               auVar93._0_4_ * auVar91._0_4_)))),
                          ZEXT1632(CONCAT412(auVar164._12_4_ * auVar93._12_4_,
                                             CONCAT48(auVar164._8_4_ * auVar93._8_4_,
                                                      CONCAT44(auVar164._4_4_ * auVar93._4_4_,
                                                               auVar164._0_4_ * auVar93._0_4_)))));
    auVar196._0_4_ = auVar96._0_4_ + fVar199;
    auVar196._4_4_ = auVar96._4_4_ + fVar215;
    auVar196._8_4_ = auVar96._8_4_ + fVar216;
    auVar196._12_4_ = auVar96._12_4_ + fVar217;
    auVar196._16_4_ = fVar163 * 0.0 + 0.0;
    auVar196._20_4_ = fVar163 * 0.0 + 0.0;
    auVar196._24_4_ = fVar163 * 0.0 + 0.0;
    auVar196._28_4_ = fVar163 + 0.0;
    auVar224 = ZEXT1632(auVar96);
    auVar160 = vsubps_avx(auVar224,auVar277);
    auVar16 = vpermps_avx2(_DAT_01fb7720,auVar160);
    auVar17 = vpermps_avx2(_DAT_01fb7720,auVar224);
    auVar160 = vmaxps_avx(auVar224,auVar196);
    auVar106 = vmaxps_avx(auVar16,auVar17);
    auVar160 = vmaxps_avx(auVar160,auVar106);
    auVar106 = vrsqrtps_avx(ZEXT1632(auVar124));
    fVar199 = auVar106._0_4_;
    fVar215 = auVar106._4_4_;
    fVar216 = auVar106._8_4_;
    fVar217 = auVar106._12_4_;
    fVar218 = auVar106._16_4_;
    fVar219 = auVar106._20_4_;
    fVar220 = auVar106._24_4_;
    auVar225._0_4_ = fVar199 * fVar199 * fVar199 * auVar124._0_4_ * -0.5;
    auVar225._4_4_ = fVar215 * fVar215 * fVar215 * auVar124._4_4_ * -0.5;
    auVar225._8_4_ = fVar216 * fVar216 * fVar216 * auVar124._8_4_ * -0.5;
    auVar225._12_4_ = fVar217 * fVar217 * fVar217 * auVar124._12_4_ * -0.5;
    auVar225._16_4_ = fVar218 * fVar218 * fVar218 * -0.0;
    auVar225._20_4_ = fVar219 * fVar219 * fVar219 * -0.0;
    auVar225._24_4_ = fVar220 * fVar220 * fVar220 * -0.0;
    auVar225._28_4_ = 0;
    auVar209._8_4_ = 0x3fc00000;
    auVar209._0_8_ = 0x3fc000003fc00000;
    auVar209._12_4_ = 0x3fc00000;
    auVar209._16_4_ = 0x3fc00000;
    auVar209._20_4_ = 0x3fc00000;
    auVar209._24_4_ = 0x3fc00000;
    auVar209._28_4_ = 0x3fc00000;
    auVar93 = vfmadd231ps_fma(auVar225,auVar209,auVar106);
    auVar228 = ZEXT1664(auVar93);
    fVar199 = auVar93._0_4_;
    fVar216 = auVar93._4_4_;
    auVar22._4_4_ = fVar229 * fVar216;
    auVar22._0_4_ = fVar221 * fVar199;
    fVar218 = auVar93._8_4_;
    auVar22._8_4_ = fVar230 * fVar218;
    fVar220 = auVar93._12_4_;
    auVar22._12_4_ = fVar231 * fVar220;
    auVar22._16_4_ = fVar281 * 0.0;
    auVar22._20_4_ = fVar282 * 0.0;
    uVar85 = auVar106._28_4_;
    auVar22._24_4_ = fVar283 * 0.0;
    auVar22._28_4_ = uVar85;
    auVar23._4_4_ = (float)local_880._4_4_ * fVar185 * fVar216;
    auVar23._0_4_ = (float)local_880._0_4_ * fVar184 * fVar199;
    auVar23._8_4_ = fStack_878 * fVar186 * fVar218;
    auVar23._12_4_ = fStack_874 * fVar187 * fVar220;
    auVar23._16_4_ = fStack_870 * fVar232 * 0.0;
    auVar23._20_4_ = fStack_86c * fVar233 * 0.0;
    auVar23._24_4_ = fStack_868 * fVar234 * 0.0;
    auVar23._28_4_ = local_2c0._28_4_;
    auVar96 = vfmadd231ps_fma(auVar23,auVar22,_local_960);
    local_280 = ZEXT1632(auVar143);
    auVar13 = vsubps_avx(ZEXT832(0) << 0x20,local_280);
    auVar244 = ZEXT3264(auVar13);
    fVar163 = auVar13._0_4_;
    fVar221 = auVar13._4_4_;
    auVar24._4_4_ = fVar221 * fVar185 * fVar216;
    auVar24._0_4_ = fVar163 * fVar184 * fVar199;
    fVar229 = auVar13._8_4_;
    auVar24._8_4_ = fVar229 * fVar186 * fVar218;
    fVar230 = auVar13._12_4_;
    auVar24._12_4_ = fVar230 * fVar187 * fVar220;
    fVar231 = auVar13._16_4_;
    auVar24._16_4_ = fVar231 * fVar232 * 0.0;
    fVar232 = auVar13._20_4_;
    auVar24._20_4_ = fVar232 * fVar233 * 0.0;
    fVar233 = auVar13._24_4_;
    auVar24._24_4_ = fVar233 * fVar234 * 0.0;
    auVar24._28_4_ = 0x3fc00000;
    local_2a0 = ZEXT1632(auVar92);
    auVar212 = vsubps_avx(ZEXT832(0) << 0x20,local_2a0);
    auVar240 = ZEXT3264(auVar212);
    auVar92 = vfmadd231ps_fma(auVar24,auVar212,auVar22);
    auVar25._4_4_ = fVar245 * fVar216;
    auVar25._0_4_ = fVar241 * fVar199;
    auVar25._8_4_ = fVar246 * fVar218;
    auVar25._12_4_ = fVar247 * fVar220;
    auVar25._16_4_ = fVar289 * 0.0;
    auVar25._20_4_ = fVar273 * 0.0;
    auVar25._24_4_ = fVar274 * 0.0;
    auVar25._28_4_ = uVar85;
    auVar143 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar25,_local_980);
    auVar271 = ZEXT1664(auVar143);
    auVar277 = ZEXT832(0) << 0x20;
    auVar114 = vsubps_avx(auVar277,auVar272);
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar114,auVar25);
    auVar106 = vsqrtps_avx(auVar105);
    auVar26._4_4_ = (float)local_880._4_4_ * fVar221;
    auVar26._0_4_ = (float)local_880._0_4_ * fVar163;
    auVar26._8_4_ = fStack_878 * fVar229;
    auVar26._12_4_ = fStack_874 * fVar230;
    auVar26._16_4_ = fStack_870 * fVar231;
    auVar26._20_4_ = fStack_86c * fVar232;
    auVar26._24_4_ = fStack_868 * fVar233;
    auVar26._28_4_ = uVar85;
    auVar96 = vfmadd231ps_fma(auVar26,_local_960,auVar212);
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),_local_980,auVar114);
    fVar215 = auVar92._0_4_;
    fVar234 = auVar143._0_4_;
    fVar217 = auVar92._4_4_;
    fVar241 = auVar143._4_4_;
    fVar219 = auVar92._8_4_;
    fVar245 = auVar143._8_4_;
    fVar184 = auVar92._12_4_;
    fVar246 = auVar143._12_4_;
    uVar85 = local_960._28_4_;
    auVar27._28_4_ = uVar85;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar246 * fVar184,
                            CONCAT48(fVar245 * fVar219,CONCAT44(fVar241 * fVar217,fVar234 * fVar215)
                                    )));
    auVar134 = vsubps_avx(ZEXT1632(auVar96),auVar27);
    auVar28._4_4_ = fVar221 * fVar221;
    auVar28._0_4_ = fVar163 * fVar163;
    auVar28._8_4_ = fVar229 * fVar229;
    auVar28._12_4_ = fVar230 * fVar230;
    auVar28._16_4_ = fVar231 * fVar231;
    auVar28._20_4_ = fVar232 * fVar232;
    auVar28._24_4_ = fVar233 * fVar233;
    auVar28._28_4_ = uVar85;
    auVar96 = vfmadd231ps_fma(auVar28,auVar212,auVar212);
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar114,auVar114);
    auVar29._28_4_ = auVar105._28_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar184 * fVar184,
                            CONCAT48(fVar219 * fVar219,CONCAT44(fVar217 * fVar217,fVar215 * fVar215)
                                    )));
    auVar211 = vsubps_avx(ZEXT1632(auVar96),auVar29);
    fVar215 = (auVar106._0_4_ + auVar160._0_4_) * 1.0000002;
    fVar217 = (auVar106._4_4_ + auVar160._4_4_) * 1.0000002;
    fVar219 = (auVar106._8_4_ + auVar160._8_4_) * 1.0000002;
    fVar184 = (auVar106._12_4_ + auVar160._12_4_) * 1.0000002;
    fVar185 = (auVar106._16_4_ + auVar160._16_4_) * 1.0000002;
    fVar186 = (auVar106._20_4_ + auVar160._20_4_) * 1.0000002;
    fVar187 = (auVar106._24_4_ + auVar160._24_4_) * 1.0000002;
    auVar30._4_4_ = fVar217 * fVar217;
    auVar30._0_4_ = fVar215 * fVar215;
    auVar30._8_4_ = fVar219 * fVar219;
    auVar30._12_4_ = fVar184 * fVar184;
    auVar30._16_4_ = fVar185 * fVar185;
    auVar30._20_4_ = fVar186 * fVar186;
    auVar30._24_4_ = fVar187 * fVar187;
    auVar30._28_4_ = auVar106._28_4_ + auVar160._28_4_;
    fVar247 = auVar134._0_4_ + auVar134._0_4_;
    fVar289 = auVar134._4_4_ + auVar134._4_4_;
    local_b60._0_8_ = CONCAT44(fVar289,fVar247);
    local_b60._8_4_ = auVar134._8_4_ + auVar134._8_4_;
    local_b60._12_4_ = auVar134._12_4_ + auVar134._12_4_;
    local_b60._16_4_ = auVar134._16_4_ + auVar134._16_4_;
    local_b60._20_4_ = auVar134._20_4_ + auVar134._20_4_;
    local_b60._24_4_ = auVar134._24_4_ + auVar134._24_4_;
    local_b60._28_4_ = auVar134._28_4_ + auVar134._28_4_;
    auVar160 = vsubps_avx(auVar211,auVar30);
    auVar269 = ZEXT1632(auVar143);
    local_b40 = ZEXT1632(CONCAT412(fVar246 * fVar246,
                                   CONCAT48(fVar245 * fVar245,
                                            CONCAT44(fVar241 * fVar241,fVar234 * fVar234))));
    local_320 = vsubps_avx(local_240,local_b40);
    auVar31._4_4_ = fVar289 * fVar289;
    auVar31._0_4_ = fVar247 * fVar247;
    auVar31._8_4_ = local_b60._8_4_ * local_b60._8_4_;
    auVar31._12_4_ = local_b60._12_4_ * local_b60._12_4_;
    auVar31._16_4_ = local_b60._16_4_ * local_b60._16_4_;
    auVar31._20_4_ = local_b60._20_4_ * local_b60._20_4_;
    auVar31._24_4_ = local_b60._24_4_ * local_b60._24_4_;
    auVar31._28_4_ = local_240._28_4_;
    fVar215 = local_320._0_4_;
    fVar217 = local_320._4_4_;
    fVar219 = local_320._8_4_;
    fVar184 = local_320._12_4_;
    fVar185 = local_320._16_4_;
    fVar186 = local_320._20_4_;
    fVar187 = local_320._24_4_;
    auVar32._4_4_ = auVar160._4_4_ * fVar217 * 4.0;
    auVar32._0_4_ = auVar160._0_4_ * fVar215 * 4.0;
    auVar32._8_4_ = auVar160._8_4_ * fVar219 * 4.0;
    auVar32._12_4_ = auVar160._12_4_ * fVar184 * 4.0;
    auVar32._16_4_ = auVar160._16_4_ * fVar185 * 4.0;
    auVar32._20_4_ = auVar160._20_4_ * fVar186 * 4.0;
    auVar32._24_4_ = auVar160._24_4_ * fVar187 * 4.0;
    auVar32._28_4_ = 0x40800000;
    auVar134 = vsubps_avx(auVar31,auVar32);
    auVar105 = vcmpps_avx(auVar134,auVar277,5);
    local_340._0_4_ = fVar215 + fVar215;
    local_340._4_4_ = fVar217 + fVar217;
    local_340._8_4_ = fVar219 + fVar219;
    local_340._12_4_ = fVar184 + fVar184;
    local_340._16_4_ = fVar185 + fVar185;
    local_340._20_4_ = fVar186 + fVar186;
    local_340._24_4_ = fVar187 + fVar187;
    local_340._28_4_ = local_320._28_4_ + local_320._28_4_;
    auVar210 = ZEXT1632(auVar92);
    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0x7f,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar105 >> 0xbf,0) == '\0') &&
        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar105[0x1f])
    {
      auVar133._8_4_ = 0x7f800000;
      auVar133._0_8_ = 0x7f8000007f800000;
      auVar133._12_4_ = 0x7f800000;
      auVar133._16_4_ = 0x7f800000;
      auVar133._20_4_ = 0x7f800000;
      auVar133._24_4_ = 0x7f800000;
      auVar133._28_4_ = 0x7f800000;
      auVar278._8_4_ = 0xff800000;
      auVar278._0_8_ = 0xff800000ff800000;
      auVar278._12_4_ = 0xff800000;
      auVar278._16_4_ = 0xff800000;
      auVar278._20_4_ = 0xff800000;
      auVar278._24_4_ = 0xff800000;
      auVar278._28_4_ = 0xff800000;
    }
    else {
      auVar12 = vsqrtps_avx(auVar134);
      auVar277 = vcmpps_avx(auVar134,auVar277,5);
      auVar134 = vrcpps_avx(local_340);
      auVar109._8_4_ = 0x3f800000;
      auVar109._0_8_ = 0x3f8000003f800000;
      auVar109._12_4_ = 0x3f800000;
      auVar109._16_4_ = 0x3f800000;
      auVar109._20_4_ = 0x3f800000;
      auVar109._24_4_ = 0x3f800000;
      auVar109._28_4_ = 0x3f800000;
      auVar92 = vfnmadd213ps_fma(auVar134,local_340,auVar109);
      auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar134,auVar134);
      auVar284._0_8_ = CONCAT44(fVar289,fVar247) ^ 0x8000000080000000;
      auVar284._8_4_ = -local_b60._8_4_;
      auVar284._12_4_ = -local_b60._12_4_;
      auVar284._16_4_ = -local_b60._16_4_;
      auVar284._20_4_ = -local_b60._20_4_;
      auVar284._24_4_ = -local_b60._24_4_;
      auVar284._28_4_ = -local_b60._28_4_;
      auVar134 = vsubps_avx(auVar284,auVar12);
      auVar33._4_4_ = auVar134._4_4_ * auVar92._4_4_;
      auVar33._0_4_ = auVar134._0_4_ * auVar92._0_4_;
      auVar33._8_4_ = auVar134._8_4_ * auVar92._8_4_;
      auVar33._12_4_ = auVar134._12_4_ * auVar92._12_4_;
      auVar33._16_4_ = auVar134._16_4_ * 0.0;
      auVar33._20_4_ = auVar134._20_4_ * 0.0;
      auVar33._24_4_ = auVar134._24_4_ * 0.0;
      auVar33._28_4_ = auVar134._28_4_;
      auVar134 = vsubps_avx(auVar12,local_b60);
      auVar279._0_4_ = auVar134._0_4_ * auVar92._0_4_;
      auVar279._4_4_ = auVar134._4_4_ * auVar92._4_4_;
      auVar279._8_4_ = auVar134._8_4_ * auVar92._8_4_;
      auVar279._12_4_ = auVar134._12_4_ * auVar92._12_4_;
      auVar279._16_4_ = auVar134._16_4_ * 0.0;
      auVar279._20_4_ = auVar134._20_4_ * 0.0;
      auVar279._24_4_ = auVar134._24_4_ * 0.0;
      auVar279._28_4_ = 0;
      auVar92 = vfmadd213ps_fma(auVar269,auVar33,auVar210);
      local_380 = auVar92._0_4_ * fVar199;
      fStack_37c = auVar92._4_4_ * fVar216;
      fStack_378 = auVar92._8_4_ * fVar218;
      fStack_374 = auVar92._12_4_ * fVar220;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = 0x3f800000;
      auVar134 = vandps_avx(local_b40,local_8c0);
      auVar134 = vmaxps_avx(local_760,auVar134);
      auVar34._4_4_ = auVar134._4_4_ * 1.9073486e-06;
      auVar34._0_4_ = auVar134._0_4_ * 1.9073486e-06;
      auVar34._8_4_ = auVar134._8_4_ * 1.9073486e-06;
      auVar34._12_4_ = auVar134._12_4_ * 1.9073486e-06;
      auVar34._16_4_ = auVar134._16_4_ * 1.9073486e-06;
      auVar34._20_4_ = auVar134._20_4_ * 1.9073486e-06;
      auVar34._24_4_ = auVar134._24_4_ * 1.9073486e-06;
      auVar34._28_4_ = auVar134._28_4_;
      auVar134 = vandps_avx(local_320,local_8c0);
      auVar134 = vcmpps_avx(auVar134,auVar34,1);
      auVar92 = vfmadd213ps_fma(auVar269,auVar279,auVar210);
      auVar110._8_4_ = 0x7f800000;
      auVar110._0_8_ = 0x7f8000007f800000;
      auVar110._12_4_ = 0x7f800000;
      auVar110._16_4_ = 0x7f800000;
      auVar110._20_4_ = 0x7f800000;
      auVar110._24_4_ = 0x7f800000;
      auVar110._28_4_ = 0x7f800000;
      auVar133 = vblendvps_avx(auVar110,auVar33,auVar277);
      local_3a0 = fVar199 * auVar92._0_4_;
      fStack_39c = fVar216 * auVar92._4_4_;
      fStack_398 = fVar218 * auVar92._8_4_;
      fStack_394 = fVar220 * auVar92._12_4_;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = 0x7f800000;
      auVar177._8_4_ = 0xff800000;
      auVar177._0_8_ = 0xff800000ff800000;
      auVar177._12_4_ = 0xff800000;
      auVar177._16_4_ = 0xff800000;
      auVar177._20_4_ = 0xff800000;
      auVar177._24_4_ = 0xff800000;
      auVar177._28_4_ = 0xff800000;
      auVar278 = vblendvps_avx(auVar177,auVar279,auVar277);
      auVar12 = auVar277 & auVar134;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar105 = vandps_avx(auVar134,auVar277);
        auVar160 = vcmpps_avx(auVar160,_DAT_01f7b000,2);
        auVar161._8_4_ = 0xff800000;
        auVar161._0_8_ = 0xff800000ff800000;
        auVar161._12_4_ = 0xff800000;
        auVar161._16_4_ = 0xff800000;
        auVar161._20_4_ = 0xff800000;
        auVar161._24_4_ = 0xff800000;
        auVar161._28_4_ = 0xff800000;
        auVar121._8_4_ = 0x7f800000;
        auVar121._0_8_ = 0x7f8000007f800000;
        auVar121._12_4_ = 0x7f800000;
        auVar121._16_4_ = 0x7f800000;
        auVar121._20_4_ = 0x7f800000;
        auVar121._24_4_ = 0x7f800000;
        auVar121._28_4_ = 0x7f800000;
        auVar134 = vblendvps_avx(auVar121,auVar161,auVar160);
        auVar92 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
        auVar12 = vpmovsxwd_avx2(auVar92);
        auVar133 = vblendvps_avx(auVar133,auVar134,auVar12);
        auVar134 = vblendvps_avx(auVar161,auVar121,auVar160);
        auVar278 = vblendvps_avx(auVar278,auVar134,auVar12);
        auVar183._0_8_ = auVar105._0_8_ ^ 0xffffffffffffffff;
        auVar183._8_4_ = auVar105._8_4_ ^ 0xffffffff;
        auVar183._12_4_ = auVar105._12_4_ ^ 0xffffffff;
        auVar183._16_4_ = auVar105._16_4_ ^ 0xffffffff;
        auVar183._20_4_ = auVar105._20_4_ ^ 0xffffffff;
        auVar183._24_4_ = auVar105._24_4_ ^ 0xffffffff;
        auVar183._28_4_ = auVar105._28_4_ ^ 0xffffffff;
        auVar105 = vorps_avx(auVar160,auVar183);
        auVar105 = vandps_avx(auVar277,auVar105);
      }
    }
    auVar263 = ZEXT3264(auVar160);
    auVar160 = local_740 & auVar105;
    fVar234 = (float)local_a60._0_4_;
    fVar241 = (float)local_a60._4_4_;
    fVar245 = fStack_a58;
    fVar246 = fStack_a54;
    fVar247 = fStack_a50;
    fVar289 = fStack_a4c;
    fVar273 = fStack_a48;
    fVar274 = fStack_a44;
    if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar160 >> 0x7f,0) != '\0') ||
          (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar160 >> 0xbf,0) != '\0') ||
        (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar160[0x1f] < '\0') {
      local_3c0 = ZEXT1632(auVar93);
      auVar263 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      fVar281 = *(float *)(ray + k * 4 + 0x100) - (float)local_a20._0_4_;
      auVar178._4_4_ = fVar281;
      auVar178._0_4_ = fVar281;
      auVar178._8_4_ = fVar281;
      auVar178._12_4_ = fVar281;
      auVar178._16_4_ = fVar281;
      auVar178._20_4_ = fVar281;
      auVar178._24_4_ = fVar281;
      auVar178._28_4_ = fVar281;
      auVar134 = vminps_avx(auVar178,auVar278);
      auVar35._4_4_ = fVar221 * local_900._4_4_;
      auVar35._0_4_ = fVar163 * (float)local_900._0_4_;
      auVar35._8_4_ = fVar229 * local_900._8_4_;
      auVar35._12_4_ = fVar230 * local_900._12_4_;
      auVar35._16_4_ = fVar231 * local_900._16_4_;
      auVar35._20_4_ = fVar232 * local_900._20_4_;
      auVar35._24_4_ = fVar233 * local_900._24_4_;
      auVar35._28_4_ = local_740._28_4_;
      auVar93 = vfmadd213ps_fma(auVar212,auVar260,auVar35);
      auVar74._4_4_ = fStack_35c;
      auVar74._0_4_ = local_360;
      auVar74._8_4_ = fStack_358;
      auVar74._12_4_ = fStack_354;
      auVar74._16_4_ = fStack_350;
      auVar74._20_4_ = fStack_34c;
      auVar74._24_4_ = fStack_348;
      auVar74._28_4_ = fStack_344;
      auVar212 = vmaxps_avx(auVar74,auVar133);
      auVar92 = vfmadd213ps_fma(auVar114,local_b00,ZEXT1632(auVar93));
      auVar36._4_4_ = (float)local_880._4_4_ * local_900._4_4_;
      auVar36._0_4_ = (float)local_880._0_4_ * (float)local_900._0_4_;
      auVar36._8_4_ = fStack_878 * local_900._8_4_;
      auVar36._12_4_ = fStack_874 * local_900._12_4_;
      auVar36._16_4_ = fStack_870 * local_900._16_4_;
      auVar36._20_4_ = fStack_86c * local_900._20_4_;
      auVar36._24_4_ = fStack_868 * local_900._24_4_;
      auVar36._28_4_ = auVar13._28_4_;
      auVar93 = vfmadd231ps_fma(auVar36,auVar260,_local_960);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar93),local_b00,_local_980);
      auVar160 = vandps_avx(ZEXT1632(auVar143),local_8c0);
      auVar111._8_4_ = 0x219392ef;
      auVar111._0_8_ = 0x219392ef219392ef;
      auVar111._12_4_ = 0x219392ef;
      auVar111._16_4_ = 0x219392ef;
      auVar111._20_4_ = 0x219392ef;
      auVar111._24_4_ = 0x219392ef;
      auVar111._28_4_ = 0x219392ef;
      auVar13 = vcmpps_avx(auVar160,auVar111,1);
      auVar160 = vrcpps_avx(ZEXT1632(auVar143));
      auVar112._8_4_ = 0x3f800000;
      auVar112._0_8_ = 0x3f8000003f800000;
      auVar112._12_4_ = 0x3f800000;
      auVar112._16_4_ = 0x3f800000;
      auVar112._20_4_ = 0x3f800000;
      auVar112._24_4_ = 0x3f800000;
      auVar112._28_4_ = 0x3f800000;
      auVar114 = ZEXT1632(auVar143);
      auVar93 = vfnmadd213ps_fma(auVar160,auVar114,auVar112);
      auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar160,auVar160);
      auVar285._0_8_ = auVar143._0_8_ ^ 0x8000000080000000;
      auVar285._8_4_ = auVar143._8_4_ ^ 0x80000000;
      auVar285._12_4_ = auVar143._12_4_ ^ 0x80000000;
      auVar285._16_4_ = 0x80000000;
      auVar285._20_4_ = 0x80000000;
      auVar285._24_4_ = 0x80000000;
      auVar285._28_4_ = 0x80000000;
      auVar37._4_4_ = auVar93._4_4_ * -auVar92._4_4_;
      auVar37._0_4_ = auVar93._0_4_ * -auVar92._0_4_;
      auVar37._8_4_ = auVar93._8_4_ * -auVar92._8_4_;
      auVar37._12_4_ = auVar93._12_4_ * -auVar92._12_4_;
      auVar37._16_4_ = 0x80000000;
      auVar37._20_4_ = 0x80000000;
      auVar37._24_4_ = 0x80000000;
      auVar37._28_4_ = 0x80000000;
      auVar160 = vcmpps_avx(auVar114,auVar285,1);
      auVar160 = vorps_avx(auVar13,auVar160);
      auVar280._8_4_ = 0xff800000;
      auVar280._0_8_ = 0xff800000ff800000;
      auVar280._12_4_ = 0xff800000;
      auVar280._16_4_ = 0xff800000;
      auVar280._20_4_ = 0xff800000;
      auVar280._24_4_ = 0xff800000;
      auVar280._28_4_ = 0xff800000;
      auVar160 = vblendvps_avx(auVar37,auVar280,auVar160);
      auVar212 = vmaxps_avx(auVar212,auVar160);
      auVar240 = ZEXT3264(auVar212);
      auVar160 = vcmpps_avx(auVar114,auVar285,6);
      auVar160 = vorps_avx(auVar13,auVar160);
      auVar286._8_4_ = 0x7f800000;
      auVar286._0_8_ = 0x7f8000007f800000;
      auVar286._12_4_ = 0x7f800000;
      auVar286._16_4_ = 0x7f800000;
      auVar286._20_4_ = 0x7f800000;
      auVar286._24_4_ = 0x7f800000;
      auVar286._28_4_ = 0x7f800000;
      auVar160 = vblendvps_avx(auVar37,auVar286,auVar160);
      auVar114 = vminps_avx(auVar134,auVar160);
      uStack_c24 = auVar14._28_4_;
      fVar163 = -auVar14._0_4_;
      fVar221 = -auVar14._4_4_;
      fVar229 = -auVar14._8_4_;
      fVar230 = -auVar14._12_4_;
      fVar231 = -auVar14._16_4_;
      fVar232 = -auVar14._20_4_;
      fVar233 = -auVar14._24_4_;
      uStack_c44 = auVar15._28_4_;
      auVar243._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
      auVar243._8_4_ = -auVar15._8_4_;
      auVar243._12_4_ = -auVar15._12_4_;
      auVar243._16_4_ = -auVar15._16_4_;
      auVar243._20_4_ = -auVar15._20_4_;
      auVar243._24_4_ = -auVar15._24_4_;
      auVar243._28_4_ = uStack_c44 ^ 0x80000000;
      auVar160 = vsubps_avx(ZEXT832(0) << 0x20,local_8e0);
      auVar13 = vsubps_avx(ZEXT832(0) << 0x20,_local_aa0);
      auVar38._4_4_ = auVar13._4_4_ * fVar221;
      auVar38._0_4_ = auVar13._0_4_ * fVar163;
      auVar38._8_4_ = auVar13._8_4_ * fVar229;
      auVar38._12_4_ = auVar13._12_4_ * fVar230;
      auVar38._16_4_ = auVar13._16_4_ * fVar231;
      auVar38._20_4_ = auVar13._20_4_ * fVar232;
      auVar38._24_4_ = auVar13._24_4_ * fVar233;
      auVar38._28_4_ = auVar13._28_4_;
      auVar93 = vfmadd231ps_fma(auVar38,auVar243,auVar160);
      uStack_c04 = auVar179._28_4_;
      auVar253._0_8_ = auVar179._0_8_ ^ 0x8000000080000000;
      auVar253._8_4_ = -auVar179._8_4_;
      auVar253._12_4_ = -auVar179._12_4_;
      auVar253._16_4_ = -auVar179._16_4_;
      auVar253._20_4_ = -auVar179._20_4_;
      auVar253._24_4_ = -auVar179._24_4_;
      auVar253._28_4_ = uStack_c04 ^ 0x80000000;
      auVar160 = vsubps_avx(ZEXT832(0) << 0x20,local_ae0);
      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar253,auVar160);
      auVar39._4_4_ = (float)local_880._4_4_ * fVar221;
      auVar39._0_4_ = (float)local_880._0_4_ * fVar163;
      auVar39._8_4_ = fStack_878 * fVar229;
      auVar39._12_4_ = fStack_874 * fVar230;
      auVar39._16_4_ = fStack_870 * fVar231;
      auVar39._20_4_ = fStack_86c * fVar232;
      auVar39._24_4_ = fStack_868 * fVar233;
      auVar39._28_4_ = uStack_c24 ^ 0x80000000;
      auVar93 = vfmadd231ps_fma(auVar39,auVar243,_local_960);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar253,_local_980);
      auVar160 = vandps_avx(ZEXT1632(auVar143),local_8c0);
      auVar134 = vrcpps_avx(ZEXT1632(auVar143));
      auVar156._8_4_ = 0x219392ef;
      auVar156._0_8_ = 0x219392ef219392ef;
      auVar156._12_4_ = 0x219392ef;
      auVar156._16_4_ = 0x219392ef;
      auVar156._20_4_ = 0x219392ef;
      auVar156._24_4_ = 0x219392ef;
      auVar156._28_4_ = 0x219392ef;
      auVar13 = vcmpps_avx(auVar160,auVar156,1);
      auVar179 = ZEXT1632(auVar143);
      auVar93 = vfnmadd213ps_fma(auVar134,auVar179,auVar112);
      auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar134,auVar134);
      auVar254._0_8_ = auVar143._0_8_ ^ 0x8000000080000000;
      auVar254._8_4_ = auVar143._8_4_ ^ 0x80000000;
      auVar254._12_4_ = auVar143._12_4_ ^ 0x80000000;
      auVar254._16_4_ = 0x80000000;
      auVar254._20_4_ = 0x80000000;
      auVar254._24_4_ = 0x80000000;
      auVar254._28_4_ = 0x80000000;
      auVar40._4_4_ = auVar93._4_4_ * -auVar92._4_4_;
      auVar40._0_4_ = auVar93._0_4_ * -auVar92._0_4_;
      auVar40._8_4_ = auVar93._8_4_ * -auVar92._8_4_;
      auVar40._12_4_ = auVar93._12_4_ * -auVar92._12_4_;
      auVar40._16_4_ = 0x80000000;
      auVar40._20_4_ = 0x80000000;
      auVar40._24_4_ = 0x80000000;
      auVar40._28_4_ = 0x80000000;
      auVar160 = vcmpps_avx(auVar179,auVar254,1);
      auVar160 = vorps_avx(auVar13,auVar160);
      auVar113._8_4_ = 0xff800000;
      auVar113._0_8_ = 0xff800000ff800000;
      auVar113._12_4_ = 0xff800000;
      auVar113._16_4_ = 0xff800000;
      auVar113._20_4_ = 0xff800000;
      auVar113._24_4_ = 0xff800000;
      auVar113._28_4_ = 0xff800000;
      auVar160 = vblendvps_avx(auVar40,auVar113,auVar160);
      local_8a0 = vmaxps_avx(auVar212,auVar160);
      auVar160 = vcmpps_avx(auVar179,auVar254,6);
      auVar160 = vorps_avx(auVar13,auVar160);
      auVar13 = vblendvps_avx(auVar40,auVar286,auVar160);
      auVar160 = vandps_avx(auVar105,local_740);
      local_3e0 = vminps_avx(auVar114,auVar13);
      auVar13 = vcmpps_avx(local_8a0,local_3e0,2);
      auVar212 = auVar160 & auVar13;
      if ((((((((auVar212 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar212 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar212 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar212 >> 0x7f,0) != '\0') ||
            (auVar212 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar212 >> 0xbf,0) != '\0') ||
          (auVar212 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar212[0x1f] < '\0') {
        auVar73._4_4_ = fStack_37c;
        auVar73._0_4_ = local_380;
        auVar73._8_4_ = fStack_378;
        auVar73._12_4_ = fStack_374;
        auVar73._16_4_ = uStack_370;
        auVar73._20_4_ = uStack_36c;
        auVar73._24_4_ = uStack_368;
        auVar73._28_4_ = uStack_364;
        auVar105 = vminps_avx(auVar73,auVar112);
        auVar240 = ZEXT864(0) << 0x20;
        auVar105 = vmaxps_avx(auVar105,ZEXT832(0) << 0x20);
        auVar72._4_4_ = fStack_39c;
        auVar72._0_4_ = local_3a0;
        auVar72._8_4_ = fStack_398;
        auVar72._12_4_ = fStack_394;
        auVar72._16_4_ = uStack_390;
        auVar72._20_4_ = uStack_38c;
        auVar72._24_4_ = uStack_388;
        auVar72._28_4_ = uStack_384;
        auVar212 = vminps_avx(auVar72,auVar112);
        auVar212 = vmaxps_avx(auVar212,ZEXT832(0) << 0x20);
        auVar41._4_4_ = (auVar105._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar105._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar105._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar105._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar105._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar105._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar105._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar105._28_4_ + 7.0;
        auVar93 = vfmadd213ps_fma(auVar41,local_940,local_920);
        auVar42._4_4_ = (auVar212._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar212._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar212._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar212._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar212._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar212._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar212._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar212._28_4_ + 7.0;
        auVar92 = vfmadd213ps_fma(auVar42,local_940,local_920);
        auVar142 = ZEXT864(0) << 0x20;
        auVar105 = vminps_avx(auVar224,auVar196);
        auVar212 = vminps_avx(auVar16,auVar17);
        auVar105 = vminps_avx(auVar105,auVar212);
        auVar106 = vsubps_avx(auVar105,auVar106);
        auVar105 = vandps_avx(auVar160,auVar13);
        local_1a0 = ZEXT1632(auVar93);
        local_1c0 = ZEXT1632(auVar92);
        auVar43._4_4_ = auVar106._4_4_ * 0.99999976;
        auVar43._0_4_ = auVar106._0_4_ * 0.99999976;
        auVar43._8_4_ = auVar106._8_4_ * 0.99999976;
        auVar43._12_4_ = auVar106._12_4_ * 0.99999976;
        auVar43._16_4_ = auVar106._16_4_ * 0.99999976;
        auVar43._20_4_ = auVar106._20_4_ * 0.99999976;
        auVar43._24_4_ = auVar106._24_4_ * 0.99999976;
        auVar43._28_4_ = auVar106._28_4_;
        auVar160 = vmaxps_avx(ZEXT832(0) << 0x20,auVar43);
        auVar44._4_4_ = auVar160._4_4_ * auVar160._4_4_;
        auVar44._0_4_ = auVar160._0_4_ * auVar160._0_4_;
        auVar44._8_4_ = auVar160._8_4_ * auVar160._8_4_;
        auVar44._12_4_ = auVar160._12_4_ * auVar160._12_4_;
        auVar44._16_4_ = auVar160._16_4_ * auVar160._16_4_;
        auVar44._20_4_ = auVar160._20_4_ * auVar160._20_4_;
        uVar2 = auVar160._28_4_;
        auVar44._24_4_ = auVar160._24_4_ * auVar160._24_4_;
        auVar44._28_4_ = uVar2;
        auVar160 = vsubps_avx(auVar211,auVar44);
        auVar45._4_4_ = auVar160._4_4_ * fVar217 * 4.0;
        auVar45._0_4_ = auVar160._0_4_ * fVar215 * 4.0;
        auVar45._8_4_ = auVar160._8_4_ * fVar219 * 4.0;
        auVar45._12_4_ = auVar160._12_4_ * fVar184 * 4.0;
        auVar45._16_4_ = auVar160._16_4_ * fVar185 * 4.0;
        auVar45._20_4_ = auVar160._20_4_ * fVar186 * 4.0;
        auVar45._24_4_ = auVar160._24_4_ * fVar187 * 4.0;
        auVar45._28_4_ = uVar2;
        auVar13 = vsubps_avx(auVar31,auVar45);
        auVar106 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
          auVar211 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar252 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar114 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar134 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar266._8_4_ = 0x7f800000;
          auVar266._0_8_ = 0x7f8000007f800000;
          auVar266._12_4_ = 0x7f800000;
          auVar266._16_4_ = 0x7f800000;
          auVar266._20_4_ = 0x7f800000;
          auVar266._24_4_ = 0x7f800000;
          auVar266._28_4_ = 0x7f800000;
          auVar270._8_4_ = 0xff800000;
          auVar270._0_8_ = 0xff800000ff800000;
          auVar270._12_4_ = 0xff800000;
          auVar270._16_4_ = 0xff800000;
          auVar270._20_4_ = 0xff800000;
          auVar270._24_4_ = 0xff800000;
          auVar270._28_4_ = 0xff800000;
        }
        else {
          auVar212 = vrcpps_avx(local_340);
          auVar93 = vfnmadd213ps_fma(local_340,auVar212,auVar112);
          auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar212,auVar212);
          auVar212 = vsqrtps_avx(auVar13);
          auVar255._0_8_ = local_b60._0_8_ ^ 0x8000000080000000;
          auVar255._8_4_ = -local_b60._8_4_;
          auVar255._12_4_ = -local_b60._12_4_;
          auVar255._16_4_ = -local_b60._16_4_;
          auVar255._20_4_ = -local_b60._20_4_;
          auVar255._24_4_ = -local_b60._24_4_;
          auVar255._28_4_ = -local_b60._28_4_;
          auVar114 = vsubps_avx(auVar255,auVar212);
          auVar212 = vsubps_avx(auVar212,local_b60);
          fVar215 = auVar114._0_4_ * auVar93._0_4_;
          fVar217 = auVar114._4_4_ * auVar93._4_4_;
          auVar46._4_4_ = fVar217;
          auVar46._0_4_ = fVar215;
          fVar219 = auVar114._8_4_ * auVar93._8_4_;
          auVar46._8_4_ = fVar219;
          fVar184 = auVar114._12_4_ * auVar93._12_4_;
          auVar46._12_4_ = fVar184;
          fVar185 = auVar114._16_4_ * 0.0;
          auVar46._16_4_ = fVar185;
          fVar186 = auVar114._20_4_ * 0.0;
          auVar46._20_4_ = fVar186;
          fVar187 = auVar114._24_4_ * 0.0;
          auVar46._24_4_ = fVar187;
          auVar46._28_4_ = uVar2;
          fVar163 = auVar212._0_4_ * auVar93._0_4_;
          fVar221 = auVar212._4_4_ * auVar93._4_4_;
          auVar47._4_4_ = fVar221;
          auVar47._0_4_ = fVar163;
          fVar229 = auVar212._8_4_ * auVar93._8_4_;
          auVar47._8_4_ = fVar229;
          fVar230 = auVar212._12_4_ * auVar93._12_4_;
          auVar47._12_4_ = fVar230;
          fVar231 = auVar212._16_4_ * 0.0;
          auVar47._16_4_ = fVar231;
          fVar232 = auVar212._20_4_ * 0.0;
          auVar47._20_4_ = fVar232;
          fVar233 = auVar212._24_4_ * 0.0;
          auVar47._24_4_ = fVar233;
          auVar47._28_4_ = auVar106._28_4_;
          auVar93 = vfmadd213ps_fma(auVar269,auVar46,auVar210);
          auVar92 = vfmadd213ps_fma(auVar269,auVar47,auVar210);
          auVar212 = ZEXT1632(CONCAT412(fVar220 * auVar93._12_4_,
                                        CONCAT48(fVar218 * auVar93._8_4_,
                                                 CONCAT44(fVar216 * auVar93._4_4_,
                                                          fVar199 * auVar93._0_4_))));
          auVar114 = ZEXT1632(CONCAT412(auVar92._12_4_ * fVar220,
                                        CONCAT48(auVar92._8_4_ * fVar218,
                                                 CONCAT44(auVar92._4_4_ * fVar216,
                                                          auVar92._0_4_ * fVar199))));
          auVar93 = vfmadd213ps_fma(local_2e0,auVar212,auVar272);
          auVar92 = vfmadd213ps_fma(local_2e0,auVar114,auVar272);
          auVar143 = vfmadd213ps_fma(local_300,auVar212,local_2a0);
          auVar96 = vfmadd213ps_fma(local_300,auVar114,local_2a0);
          auVar91 = vfmadd213ps_fma(auVar212,local_2c0,local_280);
          auVar124 = vfmadd213ps_fma(local_2c0,auVar114,local_280);
          auVar48._4_4_ = (float)local_980._4_4_ * fVar217;
          auVar48._0_4_ = (float)local_980._0_4_ * fVar215;
          auVar48._8_4_ = fStack_978 * fVar219;
          auVar48._12_4_ = fStack_974 * fVar184;
          auVar48._16_4_ = fStack_970 * fVar185;
          auVar48._20_4_ = fStack_96c * fVar186;
          auVar48._24_4_ = fStack_968 * fVar187;
          auVar48._28_4_ = 0;
          auVar114 = vsubps_avx(auVar48,ZEXT1632(auVar93));
          auVar49._4_4_ = (float)local_960._4_4_ * fVar217;
          auVar49._0_4_ = (float)local_960._0_4_ * fVar215;
          auVar49._8_4_ = fStack_958 * fVar219;
          auVar49._12_4_ = fStack_954 * fVar184;
          auVar49._16_4_ = fStack_950 * fVar185;
          auVar49._20_4_ = fStack_94c * fVar186;
          auVar49._24_4_ = fStack_948 * fVar187;
          auVar49._28_4_ = 0x80000000;
          auVar134 = vsubps_avx(auVar49,ZEXT1632(auVar143));
          auVar157._0_4_ = (float)local_880._0_4_ * fVar215;
          auVar157._4_4_ = (float)local_880._4_4_ * fVar217;
          auVar157._8_4_ = fStack_878 * fVar219;
          auVar157._12_4_ = fStack_874 * fVar184;
          auVar157._16_4_ = fStack_870 * fVar185;
          auVar157._20_4_ = fStack_86c * fVar186;
          auVar157._24_4_ = fStack_868 * fVar187;
          auVar157._28_4_ = 0;
          auVar212 = vsubps_avx(auVar157,ZEXT1632(auVar91));
          auVar142 = ZEXT3264(auVar212);
          auVar213._0_4_ = fVar163 * (float)local_980._0_4_;
          auVar213._4_4_ = fVar221 * (float)local_980._4_4_;
          auVar213._8_4_ = fVar229 * fStack_978;
          auVar213._12_4_ = fVar230 * fStack_974;
          auVar213._16_4_ = fVar231 * fStack_970;
          auVar213._20_4_ = fVar232 * fStack_96c;
          auVar213._24_4_ = fVar233 * fStack_968;
          auVar213._28_4_ = 0;
          auVar212 = vsubps_avx(auVar213,ZEXT1632(auVar92));
          auVar240 = ZEXT3264(auVar212);
          auVar50._4_4_ = (float)local_960._4_4_ * fVar221;
          auVar50._0_4_ = (float)local_960._0_4_ * fVar163;
          auVar50._8_4_ = fStack_958 * fVar229;
          auVar50._12_4_ = fStack_954 * fVar230;
          auVar50._16_4_ = fStack_950 * fVar231;
          auVar50._20_4_ = fStack_94c * fVar232;
          auVar50._24_4_ = fStack_948 * fVar233;
          auVar50._28_4_ = 0;
          auVar211 = vsubps_avx(auVar50,ZEXT1632(auVar96));
          auVar51._4_4_ = (float)local_880._4_4_ * fVar221;
          auVar51._0_4_ = (float)local_880._0_4_ * fVar163;
          auVar51._8_4_ = fStack_878 * fVar229;
          auVar51._12_4_ = fStack_874 * fVar230;
          auVar51._16_4_ = fStack_870 * fVar231;
          auVar51._20_4_ = fStack_86c * fVar232;
          auVar51._24_4_ = fStack_868 * fVar233;
          auVar51._28_4_ = uVar85;
          auVar212 = vsubps_avx(auVar51,ZEXT1632(auVar124));
          auVar252 = auVar212._0_28_;
          auVar212 = vcmpps_avx(auVar13,_DAT_01f7b000,5);
          auVar267._8_4_ = 0x7f800000;
          auVar267._0_8_ = 0x7f8000007f800000;
          auVar267._12_4_ = 0x7f800000;
          auVar267._16_4_ = 0x7f800000;
          auVar267._20_4_ = 0x7f800000;
          auVar267._24_4_ = 0x7f800000;
          auVar267._28_4_ = 0x7f800000;
          auVar266 = vblendvps_avx(auVar267,auVar46,auVar212);
          auVar13 = vandps_avx(local_8c0,local_b40);
          auVar13 = vmaxps_avx(local_760,auVar13);
          auVar52._4_4_ = auVar13._4_4_ * 1.9073486e-06;
          auVar52._0_4_ = auVar13._0_4_ * 1.9073486e-06;
          auVar52._8_4_ = auVar13._8_4_ * 1.9073486e-06;
          auVar52._12_4_ = auVar13._12_4_ * 1.9073486e-06;
          auVar52._16_4_ = auVar13._16_4_ * 1.9073486e-06;
          auVar52._20_4_ = auVar13._20_4_ * 1.9073486e-06;
          auVar52._24_4_ = auVar13._24_4_ * 1.9073486e-06;
          auVar52._28_4_ = auVar13._28_4_;
          auVar13 = vandps_avx(local_8c0,local_320);
          auVar13 = vcmpps_avx(auVar13,auVar52,1);
          auVar226._8_4_ = 0xff800000;
          auVar226._0_8_ = 0xff800000ff800000;
          auVar226._12_4_ = 0xff800000;
          auVar226._16_4_ = 0xff800000;
          auVar226._20_4_ = 0xff800000;
          auVar226._24_4_ = 0xff800000;
          auVar226._28_4_ = 0xff800000;
          auVar270 = vblendvps_avx(auVar226,auVar47,auVar212);
          auVar179 = auVar212 & auVar13;
          local_ae0 = auVar106;
          if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar179 >> 0x7f,0) != '\0') ||
                (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar179 >> 0xbf,0) != '\0') ||
              (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar179[0x1f] < '\0') {
            auVar106 = vandps_avx(auVar13,auVar212);
            auVar13 = vcmpps_avx(auVar160,_DAT_01f7b000,2);
            auVar198._8_4_ = 0x7f800000;
            auVar198._0_8_ = 0x7f8000007f800000;
            auVar198._12_4_ = 0x7f800000;
            auVar198._16_4_ = 0x7f800000;
            auVar198._20_4_ = 0x7f800000;
            auVar198._24_4_ = 0x7f800000;
            auVar198._28_4_ = 0x7f800000;
            auVar287._8_4_ = 0xff800000;
            auVar287._0_8_ = 0xff800000ff800000;
            auVar287._12_4_ = 0xff800000;
            auVar287._16_4_ = 0xff800000;
            auVar287._20_4_ = 0xff800000;
            auVar287._24_4_ = 0xff800000;
            auVar287._28_4_ = 0xff800000;
            auVar160 = vblendvps_avx(auVar198,auVar287,auVar13);
            auVar93 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
            auVar179 = vpmovsxwd_avx2(auVar93);
            auVar266 = vblendvps_avx(auVar266,auVar160,auVar179);
            auVar288._8_4_ = 0xff800000;
            auVar288._0_8_ = 0xff800000ff800000;
            auVar288._12_4_ = 0xff800000;
            auVar288._16_4_ = 0xff800000;
            auVar288._20_4_ = 0xff800000;
            auVar288._24_4_ = 0xff800000;
            auVar288._28_4_ = 0xff800000;
            auVar160 = vblendvps_avx(auVar288,auVar198,auVar13);
            auVar270 = vblendvps_avx(auVar270,auVar160,auVar179);
            auVar227._0_8_ = auVar106._0_8_ ^ 0xffffffffffffffff;
            auVar227._8_4_ = auVar106._8_4_ ^ 0xffffffff;
            auVar227._12_4_ = auVar106._12_4_ ^ 0xffffffff;
            auVar227._16_4_ = auVar106._16_4_ ^ 0xffffffff;
            auVar227._20_4_ = auVar106._20_4_ ^ 0xffffffff;
            auVar227._24_4_ = auVar106._24_4_ ^ 0xffffffff;
            auVar227._28_4_ = auVar106._28_4_ ^ 0xffffffff;
            auVar160 = vorps_avx(auVar13,auVar227);
            auVar106 = vandps_avx(auVar212,auVar160);
          }
        }
        local_560 = local_8a0;
        local_540 = vminps_avx(local_3e0,auVar266);
        _local_9a0 = vmaxps_avx(local_8a0,auVar270);
        auVar271 = ZEXT3264(_local_9a0);
        _local_400 = _local_9a0;
        auVar160 = vcmpps_avx(local_8a0,local_540,2);
        local_800 = vandps_avx(auVar160,auVar105);
        auVar13 = vcmpps_avx(_local_9a0,local_3e0,2);
        local_9c0 = vandps_avx(auVar13,auVar105);
        auVar13 = vorps_avx(local_800,local_9c0);
        auVar105 = _local_880;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0x7f,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0xbf,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar13[0x1f] < '\0') {
          auStack_9f8 = auVar17._8_24_;
          auVar53._4_4_ = auVar252._4_4_ * (float)local_880._4_4_;
          auVar53._0_4_ = auVar252._0_4_ * (float)local_880._0_4_;
          auVar53._8_4_ = auVar252._8_4_ * fStack_878;
          auVar53._12_4_ = auVar252._12_4_ * fStack_874;
          auVar53._16_4_ = auVar252._16_4_ * fStack_870;
          auVar53._20_4_ = auVar252._20_4_ * fStack_86c;
          auVar53._24_4_ = auVar252._24_4_ * fStack_868;
          auVar53._28_4_ = auVar13._28_4_;
          auVar93 = vfmadd213ps_fma(auVar211,_local_960,auVar53);
          auVar244 = ZEXT3264(_local_880);
          auVar228 = ZEXT3264(_local_980);
          auVar93 = vfmadd213ps_fma(auVar240._0_32_,_local_980,ZEXT1632(auVar93));
          auVar240 = ZEXT1664(auVar93);
          auVar181._0_8_ = auVar106._0_8_ ^ 0xffffffffffffffff;
          auVar181._8_4_ = auVar106._8_4_ ^ 0xffffffff;
          auVar181._12_4_ = auVar106._12_4_ ^ 0xffffffff;
          auVar181._16_4_ = auVar106._16_4_ ^ 0xffffffff;
          auVar181._20_4_ = auVar106._20_4_ ^ 0xffffffff;
          auVar181._24_4_ = auVar106._24_4_ ^ 0xffffffff;
          auVar181._28_4_ = auVar106._28_4_ ^ 0xffffffff;
          auVar105 = vandps_avx(local_8c0,ZEXT1632(auVar93));
          auVar214._8_4_ = 0x3e99999a;
          auVar214._0_8_ = 0x3e99999a3e99999a;
          auVar214._12_4_ = 0x3e99999a;
          auVar214._16_4_ = 0x3e99999a;
          auVar214._20_4_ = 0x3e99999a;
          auVar214._24_4_ = 0x3e99999a;
          auVar214._28_4_ = 0x3e99999a;
          auVar105 = vcmpps_avx(auVar105,auVar214,1);
          local_840 = vorps_avx(auVar105,auVar181);
          auVar162._0_4_ = (float)local_880._0_4_ * auVar142._0_4_;
          auVar162._4_4_ = (float)local_880._4_4_ * auVar142._4_4_;
          auVar162._8_4_ = fStack_878 * auVar142._8_4_;
          auVar162._12_4_ = fStack_874 * auVar142._12_4_;
          auVar162._16_4_ = fStack_870 * auVar142._16_4_;
          auVar162._20_4_ = fStack_86c * auVar142._20_4_;
          auVar162._28_36_ = auVar142._28_36_;
          auVar162._24_4_ = fStack_868 * auVar142._24_4_;
          auVar93 = vfmadd213ps_fma(auVar134,_local_960,auVar162._0_32_);
          auVar93 = vfmadd213ps_fma(auVar114,_local_980,ZEXT1632(auVar93));
          auVar105 = vandps_avx(local_8c0,ZEXT1632(auVar93));
          auVar105 = vcmpps_avx(auVar105,auVar214,1);
          auVar105 = vorps_avx(auVar105,auVar181);
          auVar136._8_4_ = 3;
          auVar136._0_8_ = 0x300000003;
          auVar136._12_4_ = 3;
          auVar136._16_4_ = 3;
          auVar136._20_4_ = 3;
          auVar136._24_4_ = 3;
          auVar136._28_4_ = 3;
          auVar159._8_4_ = 2;
          auVar159._0_8_ = 0x200000002;
          auVar159._12_4_ = 2;
          auVar159._16_4_ = 2;
          auVar159._20_4_ = 2;
          auVar159._24_4_ = 2;
          auVar159._28_4_ = 2;
          auVar105 = vblendvps_avx(auVar159,auVar136,auVar105);
          local_860._4_4_ = local_cc4;
          local_860._0_4_ = local_cc4;
          local_860._8_4_ = local_cc4;
          local_860._12_4_ = local_cc4;
          local_860._16_4_ = local_cc4;
          local_860._20_4_ = local_cc4;
          local_860._24_4_ = local_cc4;
          local_860._28_4_ = local_cc4;
          local_820 = vpcmpgtd_avx2(auVar105,local_860);
          local_580 = vpandn_avx2(local_820,local_800);
          local_9e0._4_4_ = local_8a0._4_4_ + (float)local_a60._4_4_;
          local_9e0._0_4_ = local_8a0._0_4_ + (float)local_a60._0_4_;
          fStack_9d8 = local_8a0._8_4_ + fStack_a58;
          fStack_9d4 = local_8a0._12_4_ + fStack_a54;
          fStack_9d0 = local_8a0._16_4_ + fStack_a50;
          fStack_9cc = local_8a0._20_4_ + fStack_a4c;
          fStack_9c8 = local_8a0._24_4_ + fStack_a48;
          fStack_9c4 = local_8a0._28_4_ + fStack_a44;
          while( true ) {
            fStack_bcc = auVar8._4_4_;
            fStack_bc8 = auVar8._8_4_;
            fStack_bc4 = auVar8._12_4_;
            if ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_580 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_580 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_580 >> 0x7f,0) == '\0') &&
                  (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_580 >> 0xbf,0) == '\0') &&
                (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_580[0x1f]) break;
            auVar137._8_4_ = 0x7f800000;
            auVar137._0_8_ = 0x7f8000007f800000;
            auVar137._12_4_ = 0x7f800000;
            auVar137._16_4_ = 0x7f800000;
            auVar137._20_4_ = 0x7f800000;
            auVar137._24_4_ = 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar105 = vblendvps_avx(auVar137,local_8a0,local_580);
            auVar160 = vshufps_avx(auVar105,auVar105,0xb1);
            auVar160 = vminps_avx(auVar105,auVar160);
            auVar106 = vshufpd_avx(auVar160,auVar160,5);
            auVar160 = vminps_avx(auVar160,auVar106);
            auVar106 = vpermpd_avx2(auVar160,0x4e);
            auVar160 = vminps_avx(auVar160,auVar106);
            auVar160 = vcmpps_avx(auVar105,auVar160,0);
            auVar106 = local_580 & auVar160;
            auVar105 = local_580;
            if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar106 >> 0x7f,0) != '\0') ||
                  (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0xbf,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar106[0x1f] < '\0') {
              auVar105 = vandps_avx(auVar160,local_580);
            }
            uVar79 = vmovmskps_avx(auVar105);
            iVar78 = 0;
            for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
              iVar78 = iVar78 + 1;
            }
            uVar82 = iVar78 << 2;
            *(undefined4 *)(local_580 + uVar82) = 0;
            uVar79 = *(uint *)(local_1a0 + uVar82);
            uVar82 = *(uint *)(local_560 + uVar82);
            fVar199 = auVar6._0_4_;
            if ((float)local_a80._0_4_ < 0.0) {
              auVar244 = ZEXT1664(auVar244._0_16_);
              auVar271 = ZEXT1664(auVar271._0_16_);
              fVar199 = sqrtf((float)local_a80._0_4_);
            }
            auVar240 = ZEXT464(uVar82);
            auVar228 = ZEXT464(uVar79);
            auVar92 = vminps_avx(auVar9,auVar11);
            auVar93 = vmaxps_avx(auVar9,auVar11);
            auVar143 = vminps_avx(auVar10,auVar8);
            auVar96 = vminps_avx(auVar92,auVar143);
            auVar92 = vmaxps_avx(auVar10,auVar8);
            auVar143 = vmaxps_avx(auVar93,auVar92);
            auVar93 = vandps_avx(auVar96,auVar242);
            auVar92 = vandps_avx(auVar143,auVar242);
            auVar93 = vmaxps_avx(auVar93,auVar92);
            auVar92 = vmovshdup_avx(auVar93);
            auVar92 = vmaxss_avx(auVar92,auVar93);
            auVar93 = vshufpd_avx(auVar93,auVar93,1);
            auVar93 = vmaxss_avx(auVar93,auVar92);
            local_ae0._0_4_ = auVar93._0_4_ * 1.9073486e-06;
            local_900._0_4_ = fVar199 * 1.9073486e-06;
            local_940._0_16_ = vshufps_avx(auVar143,auVar143,0xff);
            auVar93 = vinsertps_avx(ZEXT416(uVar82),ZEXT416(uVar79),0x10);
            auVar142 = ZEXT1664(auVar93);
            lVar81 = 5;
            do {
              do {
                bVar87 = lVar81 == 0;
                lVar81 = lVar81 + -1;
                if (bVar87) goto LAB_0116f11b;
                uVar85 = auVar142._0_4_;
                auVar95._4_4_ = uVar85;
                auVar95._0_4_ = uVar85;
                auVar95._8_4_ = uVar85;
                auVar95._12_4_ = uVar85;
                auVar92 = vfmadd213ps_fma(auVar95,local_a70,_DAT_01f45a50);
                auVar164 = auVar142._0_16_;
                local_b20 = vmovshdup_avx(auVar164);
                fVar219 = local_b20._0_4_;
                fVar218 = 1.0 - fVar219;
                auVar124 = SUB6416(ZEXT464(0x40400000),0);
                auVar91 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar143 = vfmadd213ss_fma(auVar124,local_b20,auVar91);
                auVar93 = vfmadd213ss_fma(auVar143,ZEXT416((uint)(fVar219 * fVar219)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar96 = vfmadd213ss_fma(auVar124,ZEXT416((uint)fVar218),auVar91);
                auVar96 = vfmadd213ss_fma(auVar96,ZEXT416((uint)(fVar218 * fVar218)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar199 = fVar218 * fVar218 * -fVar219 * 0.5;
                fVar215 = auVar93._0_4_ * 0.5;
                fVar216 = auVar96._0_4_ * 0.5;
                fVar217 = fVar219 * fVar219 * -fVar218 * 0.5;
                auVar165._0_4_ = fVar217 * fVar122;
                auVar165._4_4_ = fVar217 * fStack_bcc;
                auVar165._8_4_ = fVar217 * fStack_bc8;
                auVar165._12_4_ = fVar217 * fStack_bc4;
                auVar190._4_4_ = fVar216;
                auVar190._0_4_ = fVar216;
                auVar190._8_4_ = fVar216;
                auVar190._12_4_ = fVar216;
                auVar93 = vfmadd132ps_fma(auVar190,auVar165,auVar10);
                auVar144._4_4_ = fVar215;
                auVar144._0_4_ = fVar215;
                auVar144._8_4_ = fVar215;
                auVar144._12_4_ = fVar215;
                auVar93 = vfmadd132ps_fma(auVar144,auVar93,auVar11);
                auVar166._4_4_ = fVar199;
                auVar166._0_4_ = fVar199;
                auVar166._8_4_ = fVar199;
                auVar166._12_4_ = fVar199;
                auVar93 = vfmadd132ps_fma(auVar166,auVar93,auVar9);
                auVar91 = vfmadd231ss_fma(auVar91,local_b20,ZEXT416(0x41100000));
                auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_b20,
                                          ZEXT416(0x40800000));
                local_b00._0_16_ = auVar96;
                local_8e0._0_16_ = auVar93;
                auVar93 = vsubps_avx(auVar92,auVar93);
                _local_aa0 = auVar93;
                auVar93 = vdpps_avx(auVar93,auVar93,0x7f);
                auVar92 = vfmadd213ss_fma(auVar124,local_b20,ZEXT416(0xbf800000));
                fVar199 = auVar93._0_4_;
                if (fVar199 < 0.0) {
                  local_b40._0_16_ = auVar91;
                  local_b60._0_4_ = fVar218 * -2.0;
                  auVar240._0_4_ = sqrtf(fVar199);
                  auVar240._4_60_ = extraout_var;
                  auVar143 = ZEXT416(auVar143._0_4_);
                  auVar142 = ZEXT1664(auVar164);
                  auVar96 = auVar240._0_16_;
                  fVar215 = (float)local_b60._0_4_;
                  auVar91 = local_b40._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar93,auVar93);
                  fVar215 = fVar218 * -2.0;
                }
                fVar216 = local_b20._0_4_;
                auVar124 = vfmadd213ss_fma(auVar143,ZEXT416((uint)(fVar216 + fVar216)),
                                           ZEXT416((uint)(fVar216 * fVar216 * 3.0)));
                auVar123 = SUB6416(ZEXT464(0x40000000),0);
                auVar143 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_b20,auVar123);
                auVar189 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar218 * -3.0)),
                                           ZEXT416((uint)(fVar218 + fVar218)),auVar143);
                auVar90 = vfnmadd231ss_fma(ZEXT416((uint)(fVar216 * (fVar218 + fVar218))),
                                           ZEXT416((uint)fVar218),ZEXT416((uint)fVar218));
                auVar143 = vfmadd213ss_fma(ZEXT416((uint)fVar215),local_b20,
                                           ZEXT416((uint)(fVar219 * fVar219)));
                fVar215 = auVar189._0_4_ * 0.5;
                fVar216 = auVar143._0_4_ * 0.5;
                auVar145._0_4_ = fVar122 * fVar216;
                auVar145._4_4_ = fStack_bcc * fVar216;
                auVar145._8_4_ = fStack_bc8 * fVar216;
                auVar145._12_4_ = fStack_bc4 * fVar216;
                auVar125._4_4_ = fVar215;
                auVar125._0_4_ = fVar215;
                auVar125._8_4_ = fVar215;
                auVar125._12_4_ = fVar215;
                auVar143 = vfmadd213ps_fma(auVar125,auVar10,auVar145);
                fVar215 = auVar90._0_4_ * 0.5;
                fVar216 = auVar124._0_4_ * 0.5;
                auVar146._4_4_ = fVar216;
                auVar146._0_4_ = fVar216;
                auVar146._8_4_ = fVar216;
                auVar146._12_4_ = fVar216;
                auVar143 = vfmadd213ps_fma(auVar146,auVar11,auVar143);
                auVar258._4_4_ = fVar215;
                auVar258._0_4_ = fVar215;
                auVar258._8_4_ = fVar215;
                auVar258._12_4_ = fVar215;
                auVar124 = vfmadd213ps_fma(auVar258,auVar9,auVar143);
                auVar189 = vfmadd213ss_fma(local_b20,SUB6416(ZEXT464(0xc0400000),0),auVar123);
                local_c00 = auVar92._0_4_;
                auVar97._0_4_ = fVar122 * local_c00;
                auVar97._4_4_ = fStack_bcc * local_c00;
                auVar97._8_4_ = fStack_bc8 * local_c00;
                auVar97._12_4_ = fStack_bc4 * local_c00;
                auVar126._4_4_ = local_b00._0_4_;
                auVar126._0_4_ = local_b00._0_4_;
                auVar126._8_4_ = local_b00._0_4_;
                auVar126._12_4_ = local_b00._0_4_;
                auVar92 = vfmadd213ps_fma(auVar126,auVar10,auVar97);
                uVar85 = auVar91._0_4_;
                auVar147._4_4_ = uVar85;
                auVar147._0_4_ = uVar85;
                auVar147._8_4_ = uVar85;
                auVar147._12_4_ = uVar85;
                auVar92 = vfmadd213ps_fma(auVar147,auVar11,auVar92);
                auVar143 = vdpps_avx(auVar124,auVar124,0x7f);
                uVar85 = auVar189._0_4_;
                auVar127._4_4_ = uVar85;
                auVar127._0_4_ = uVar85;
                auVar127._8_4_ = uVar85;
                auVar127._12_4_ = uVar85;
                auVar189 = vfmadd213ps_fma(auVar127,auVar9,auVar92);
                auVar92 = vblendps_avx(auVar143,_DAT_01f45a50,0xe);
                auVar91 = vrsqrtss_avx(auVar92,auVar92);
                fVar217 = auVar143._0_4_;
                fVar215 = auVar91._0_4_;
                auVar91 = vdpps_avx(auVar124,auVar189,0x7f);
                fVar215 = fVar215 * 1.5 + fVar217 * -0.5 * fVar215 * fVar215 * fVar215;
                auVar128._0_4_ = auVar189._0_4_ * fVar217;
                auVar128._4_4_ = auVar189._4_4_ * fVar217;
                auVar128._8_4_ = auVar189._8_4_ * fVar217;
                auVar128._12_4_ = auVar189._12_4_ * fVar217;
                fVar216 = auVar91._0_4_;
                auVar204._0_4_ = auVar124._0_4_ * fVar216;
                auVar204._4_4_ = auVar124._4_4_ * fVar216;
                fVar218 = auVar124._8_4_;
                auVar204._8_4_ = fVar218 * fVar216;
                fVar219 = auVar124._12_4_;
                auVar204._12_4_ = fVar219 * fVar216;
                auVar91 = vsubps_avx(auVar128,auVar204);
                auVar92 = vrcpss_avx(auVar92,auVar92);
                auVar189 = vfnmadd213ss_fma(auVar92,auVar143,auVar123);
                fVar216 = auVar92._0_4_ * auVar189._0_4_;
                auVar92 = vmaxss_avx(ZEXT416((uint)local_ae0._0_4_),
                                     ZEXT416((uint)(auVar142._0_4_ * (float)local_900._0_4_)));
                auVar244 = ZEXT1664(auVar92);
                auVar237._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
                auVar237._8_4_ = -fVar218;
                auVar237._12_4_ = -fVar219;
                auVar167._0_4_ = fVar215 * auVar91._0_4_ * fVar216;
                auVar167._4_4_ = fVar215 * auVar91._4_4_ * fVar216;
                auVar167._8_4_ = fVar215 * auVar91._8_4_ * fVar216;
                auVar167._12_4_ = fVar215 * auVar91._12_4_ * fVar216;
                auVar250._0_4_ = auVar124._0_4_ * fVar215;
                auVar250._4_4_ = auVar124._4_4_ * fVar215;
                auVar250._8_4_ = fVar218 * fVar215;
                auVar250._12_4_ = fVar219 * fVar215;
                local_b00._0_4_ = auVar92._0_4_;
                local_b20 = auVar124;
                if (fVar217 < -fVar217) {
                  fVar215 = sqrtf(fVar217);
                  auVar244 = ZEXT464((uint)local_b00._0_4_);
                  auVar96 = ZEXT416(auVar96._0_4_);
                }
                else {
                  auVar92 = vsqrtss_avx(auVar143,auVar143);
                  fVar215 = auVar92._0_4_;
                }
                auVar92 = vdpps_avx(_local_aa0,auVar250,0x7f);
                auVar189 = vfmadd213ss_fma(ZEXT416((uint)local_ae0._0_4_),auVar96,auVar244._0_16_);
                auVar143 = vdpps_avx(auVar237,auVar250,0x7f);
                auVar91 = vdpps_avx(_local_aa0,auVar167,0x7f);
                auVar124 = vdpps_avx(local_a70,auVar250,0x7f);
                auVar189 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_ae0._0_4_ / fVar215)),
                                           auVar189);
                fVar215 = auVar143._0_4_ + auVar91._0_4_;
                auVar271 = ZEXT464((uint)fVar215);
                fVar217 = auVar92._0_4_;
                auVar98._0_4_ = fVar217 * fVar217;
                auVar98._4_4_ = auVar92._4_4_ * auVar92._4_4_;
                auVar98._8_4_ = auVar92._8_4_ * auVar92._8_4_;
                auVar98._12_4_ = auVar92._12_4_ * auVar92._12_4_;
                auVar143 = vdpps_avx(_local_aa0,auVar237,0x7f);
                auVar91 = vsubps_avx(auVar93,auVar98);
                auVar96 = vrsqrtss_avx(auVar91,auVar91);
                fVar218 = auVar91._0_4_;
                fVar216 = auVar96._0_4_;
                fVar216 = fVar216 * 1.5 + fVar218 * -0.5 * fVar216 * fVar216 * fVar216;
                auVar96 = vdpps_avx(_local_aa0,local_a70,0x7f);
                auVar143 = vfnmadd231ss_fma(auVar143,auVar92,ZEXT416((uint)fVar215));
                auVar96 = vfnmadd231ss_fma(auVar96,auVar92,auVar124);
                if (fVar218 < 0.0) {
                  local_b40._0_16_ = auVar143;
                  local_b60._0_4_ = fVar216;
                  local_920._0_16_ = auVar96;
                  fVar218 = sqrtf(fVar218);
                  auVar271 = ZEXT1664(ZEXT416((uint)fVar215));
                  auVar244 = ZEXT464((uint)local_b00._0_4_);
                  fVar216 = (float)local_b60._0_4_;
                  auVar96 = local_920._0_16_;
                  auVar143 = local_b40._0_16_;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  fVar218 = auVar91._0_4_;
                }
                auVar228 = ZEXT1664(auVar93);
                auVar240 = ZEXT1664(local_b20);
                auVar91 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar218 = fVar218 - auVar91._0_4_;
                auVar91 = vshufps_avx(local_b20,local_b20,0xff);
                auVar143 = vfmsub213ss_fma(auVar143,ZEXT416((uint)fVar216),auVar91);
                auVar168._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
                auVar168._8_4_ = auVar124._8_4_ ^ 0x80000000;
                auVar168._12_4_ = auVar124._12_4_ ^ 0x80000000;
                auVar191._0_8_ = auVar143._0_8_ ^ 0x8000000080000000;
                auVar191._8_4_ = auVar143._8_4_ ^ 0x80000000;
                auVar191._12_4_ = auVar143._12_4_ ^ 0x80000000;
                auVar90 = ZEXT416((uint)(auVar96._0_4_ * fVar216));
                auVar123 = auVar271._0_16_;
                auVar96 = vfmsub231ss_fma(ZEXT416((uint)(auVar124._0_4_ * auVar143._0_4_)),auVar123,
                                          auVar90);
                auVar143 = vinsertps_avx(auVar191,auVar90,0x1c);
                uVar85 = auVar96._0_4_;
                auVar192._4_4_ = uVar85;
                auVar192._0_4_ = uVar85;
                auVar192._8_4_ = uVar85;
                auVar192._12_4_ = uVar85;
                auVar143 = vdivps_avx(auVar143,auVar192);
                auVar96 = vinsertps_avx(auVar123,auVar168,0x10);
                auVar96 = vdivps_avx(auVar96,auVar192);
                auVar148._0_4_ = fVar217 * auVar143._0_4_ + fVar218 * auVar96._0_4_;
                auVar148._4_4_ = fVar217 * auVar143._4_4_ + fVar218 * auVar96._4_4_;
                auVar148._8_4_ = fVar217 * auVar143._8_4_ + fVar218 * auVar96._8_4_;
                auVar148._12_4_ = fVar217 * auVar143._12_4_ + fVar218 * auVar96._12_4_;
                auVar143 = vsubps_avx(auVar164,auVar148);
                auVar142 = ZEXT1664(auVar143);
                auVar92 = vandps_avx(auVar92,auVar242);
              } while (auVar189._0_4_ <= auVar92._0_4_);
              auVar96 = vfmadd231ss_fma(ZEXT416((uint)(auVar244._0_4_ + auVar189._0_4_)),
                                        local_940._0_16_,ZEXT416(0x36000000));
              auVar92 = vandps_avx(ZEXT416((uint)fVar218),auVar242);
            } while (auVar96._0_4_ <= auVar92._0_4_);
            fVar215 = auVar143._0_4_ + (float)local_a20._0_4_;
            if (fVar88 <= fVar215) {
              fVar216 = *(float *)(ray + k * 4 + 0x100);
              auVar244 = ZEXT464((uint)fVar216);
              if (fVar215 <= fVar216) {
                auVar92 = vmovshdup_avx(auVar143);
                fVar217 = auVar92._0_4_;
                if ((0.0 <= fVar217) && (fVar217 <= 1.0)) {
                  auVar143 = vrsqrtss_avx(auVar93,auVar93);
                  fVar218 = auVar143._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar80].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    fVar199 = fVar218 * 1.5 + fVar199 * -0.5 * fVar218 * fVar218 * fVar218;
                    auVar169._0_4_ = fVar199 * (float)local_aa0._0_4_;
                    auVar169._4_4_ = fVar199 * (float)local_aa0._4_4_;
                    auVar169._8_4_ = fVar199 * fStack_a98;
                    auVar169._12_4_ = fVar199 * fStack_a94;
                    auVar124 = vfmadd213ps_fma(auVar91,auVar169,local_b20);
                    auVar143 = vshufps_avx(auVar169,auVar169,0xc9);
                    auVar96 = vshufps_avx(local_b20,local_b20,0xc9);
                    auVar170._0_4_ = auVar169._0_4_ * auVar96._0_4_;
                    auVar170._4_4_ = auVar169._4_4_ * auVar96._4_4_;
                    auVar170._8_4_ = auVar169._8_4_ * auVar96._8_4_;
                    auVar170._12_4_ = auVar169._12_4_ * auVar96._12_4_;
                    auVar91 = vfmsub231ps_fma(auVar170,local_b20,auVar143);
                    auVar143 = vshufps_avx(auVar91,auVar91,0xc9);
                    auVar96 = vshufps_avx(auVar124,auVar124,0xc9);
                    auVar91 = vshufps_avx(auVar91,auVar91,0xd2);
                    auVar99._0_4_ = auVar124._0_4_ * auVar91._0_4_;
                    auVar99._4_4_ = auVar124._4_4_ * auVar91._4_4_;
                    auVar99._8_4_ = auVar124._8_4_ * auVar91._8_4_;
                    auVar99._12_4_ = auVar124._12_4_ * auVar91._12_4_;
                    auVar143 = vfmsub231ps_fma(auVar99,auVar143,auVar96);
                    uVar85 = auVar143._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar215;
                      uVar2 = vextractps_avx(auVar143,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar2;
                      uVar2 = vextractps_avx(auVar143,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar2;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar85;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar217;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_a00;
                      *(uint *)(ray + k * 4 + 0x240) = uVar80;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar5 = context->user;
                      local_4c0 = auVar92._0_8_;
                      auVar92 = vmovshdup_avx(auVar143);
                      local_520._8_8_ = auVar92._0_8_;
                      auVar92 = vshufps_avx(auVar143,auVar143,0xaa);
                      local_500 = auVar92._0_8_;
                      local_520._0_8_ = local_520._8_8_;
                      local_520._16_8_ = local_520._8_8_;
                      local_520._24_8_ = local_520._8_8_;
                      uStack_4f8 = local_500;
                      uStack_4f0 = local_500;
                      uStack_4e8 = local_500;
                      local_4e0 = uVar85;
                      uStack_4dc = uVar85;
                      uStack_4d8 = uVar85;
                      uStack_4d4 = uVar85;
                      uStack_4d0 = uVar85;
                      uStack_4cc = uVar85;
                      uStack_4c8 = uVar85;
                      uStack_4c4 = uVar85;
                      uStack_4b8 = local_4c0;
                      uStack_4b0 = local_4c0;
                      uStack_4a8 = local_4c0;
                      auVar149._12_4_ = 0;
                      auVar149._0_12_ = ZEXT812(0);
                      auVar149 = auVar149 << 0x20;
                      local_4a0 = ZEXT1232(ZEXT812(0)) << 0x20;
                      local_480 = CONCAT44(uStack_79c,local_7a0);
                      uStack_478 = CONCAT44(uStack_794,uStack_798);
                      uStack_470 = CONCAT44(uStack_78c,uStack_790);
                      uStack_468 = CONCAT44(uStack_784,uStack_788);
                      local_460._4_4_ = uStack_77c;
                      local_460._0_4_ = local_780;
                      local_460._8_4_ = uStack_778;
                      local_460._12_4_ = uStack_774;
                      local_460._16_4_ = uStack_770;
                      local_460._20_4_ = uStack_76c;
                      local_460._24_4_ = uStack_768;
                      local_460._28_4_ = uStack_764;
                      auVar105 = vpcmpeqd_avx2(local_460,local_460);
                      local_aa8[1] = auVar105;
                      *local_aa8 = auVar105;
                      local_440 = pRVar5->instID[0];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_420 = pRVar5->instPrimID[0];
                      uStack_41c = local_420;
                      uStack_418 = local_420;
                      uStack_414 = local_420;
                      uStack_410 = local_420;
                      uStack_40c = local_420;
                      uStack_408 = local_420;
                      uStack_404 = local_420;
                      *(float *)(ray + k * 4 + 0x100) = fVar215;
                      local_a40 = local_7c0;
                      local_b90.valid = (int *)local_a40;
                      local_b90.geometryUserPtr = pGVar3->userPtr;
                      local_b90.context = context->user;
                      local_b90.hit = (RTCHitN *)local_520;
                      local_b90.N = 8;
                      local_b90.ray = (RTCRayN *)ray;
                      if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar228 = ZEXT1664(auVar93);
                        auVar240 = ZEXT1664(local_b20);
                        auVar271 = ZEXT1664(auVar123);
                        (*pGVar3->intersectionFilterN)(&local_b90);
                        auVar149 = ZEXT816(0) << 0x40;
                      }
                      auVar160 = ZEXT1632(auVar149);
                      auVar105 = vpcmpeqd_avx2(local_a40,auVar160);
                      auVar105 = _DAT_01f7b020 & ~auVar105;
                      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar105 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar105 >> 0x7f,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar105 >> 0xbf,0) != '\0') ||
                          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar105[0x1f] < '\0') {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar228 = ZEXT1664(auVar228._0_16_);
                          auVar240 = ZEXT1664(auVar240._0_16_);
                          auVar271 = ZEXT1664(auVar271._0_16_);
                          (*p_Var4)(&local_b90);
                          auVar160 = ZEXT832(0) << 0x40;
                        }
                        auVar244 = ZEXT464((uint)fVar216);
                        auVar160 = vpcmpeqd_avx2(local_a40,auVar160);
                        auVar105 = _DAT_01f7b020 & ~auVar160;
                        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar105 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar105 >> 0x7f,0) != '\0')
                              || (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar105 >> 0xbf,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar105[0x1f] < '\0') {
                          auVar117._0_8_ = auVar160._0_8_ ^ 0xffffffffffffffff;
                          auVar117._8_4_ = auVar160._8_4_ ^ 0xffffffff;
                          auVar117._12_4_ = auVar160._12_4_ ^ 0xffffffff;
                          auVar117._16_4_ = auVar160._16_4_ ^ 0xffffffff;
                          auVar117._20_4_ = auVar160._20_4_ ^ 0xffffffff;
                          auVar117._24_4_ = auVar160._24_4_ ^ 0xffffffff;
                          auVar117._28_4_ = auVar160._28_4_ ^ 0xffffffff;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])local_b90.hit);
                          *(undefined1 (*) [32])(local_b90.ray + 0x180) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_b90.hit + 0x20));
                          *(undefined1 (*) [32])(local_b90.ray + 0x1a0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_b90.hit + 0x40));
                          *(undefined1 (*) [32])(local_b90.ray + 0x1c0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_b90.hit + 0x60));
                          *(undefined1 (*) [32])(local_b90.ray + 0x1e0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_b90.hit + 0x80));
                          *(undefined1 (*) [32])(local_b90.ray + 0x200) = auVar105;
                          auVar105 = vpmaskmovd_avx2(auVar117,*(undefined1 (*) [32])
                                                               (local_b90.hit + 0xa0));
                          *(undefined1 (*) [32])(local_b90.ray + 0x220) = auVar105;
                          auVar105 = vpmaskmovd_avx2(auVar117,*(undefined1 (*) [32])
                                                               (local_b90.hit + 0xc0));
                          *(undefined1 (*) [32])(local_b90.ray + 0x240) = auVar105;
                          auVar105 = vpmaskmovd_avx2(auVar117,*(undefined1 (*) [32])
                                                               (local_b90.hit + 0xe0));
                          *(undefined1 (*) [32])(local_b90.ray + 0x260) = auVar105;
                          auVar105 = vpmaskmovd_avx2(auVar117,*(undefined1 (*) [32])
                                                               (local_b90.hit + 0x100));
                          *(undefined1 (*) [32])(local_b90.ray + 0x280) = auVar105;
                          goto LAB_0116f11b;
                        }
                      }
                      auVar244 = ZEXT464((uint)fVar216);
                      *(float *)(ray + k * 4 + 0x100) = fVar216;
                    }
                  }
                }
              }
            }
LAB_0116f11b:
            uVar85 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar261._4_4_ = uVar85;
            auVar261._0_4_ = uVar85;
            auVar261._8_4_ = uVar85;
            auVar261._12_4_ = uVar85;
            auVar261._16_4_ = uVar85;
            auVar261._20_4_ = uVar85;
            auVar261._24_4_ = uVar85;
            auVar261._28_4_ = uVar85;
            auVar263 = ZEXT3264(auVar261);
            auVar105 = vcmpps_avx(_local_9e0,auVar261,2);
            local_580 = vandps_avx(auVar105,local_580);
          }
          auVar118._0_4_ = (float)local_a60._0_4_ + (float)local_9a0._0_4_;
          auVar118._4_4_ = (float)local_a60._4_4_ + (float)local_9a0._4_4_;
          auVar118._8_4_ = fStack_a58 + fStack_998;
          auVar118._12_4_ = fStack_a54 + fStack_994;
          auVar118._16_4_ = fStack_a50 + fStack_990;
          auVar118._20_4_ = fStack_a4c + fStack_98c;
          auVar118._24_4_ = fStack_a48 + fStack_988;
          auVar118._28_4_ = fStack_a44 + fStack_984;
          uVar85 = auVar263._0_4_;
          auVar138._4_4_ = uVar85;
          auVar138._0_4_ = uVar85;
          auVar138._8_4_ = uVar85;
          auVar138._12_4_ = uVar85;
          auVar138._16_4_ = uVar85;
          auVar138._20_4_ = uVar85;
          auVar138._24_4_ = uVar85;
          auVar138._28_4_ = uVar85;
          auVar105 = vcmpps_avx(auVar118,auVar138,2);
          local_9c0 = vandps_avx(auVar105,local_9c0);
          auVar119._8_4_ = 3;
          auVar119._0_8_ = 0x300000003;
          auVar119._12_4_ = 3;
          auVar119._16_4_ = 3;
          auVar119._20_4_ = 3;
          auVar119._24_4_ = 3;
          auVar119._28_4_ = 3;
          auVar139._8_4_ = 2;
          auVar139._0_8_ = 0x200000002;
          auVar139._12_4_ = 2;
          auVar139._16_4_ = 2;
          auVar139._20_4_ = 2;
          auVar139._24_4_ = 2;
          auVar139._28_4_ = 2;
          auVar105 = vblendvps_avx(auVar139,auVar119,local_840);
          _local_9e0 = vpcmpgtd_avx2(auVar105,local_860);
          local_5a0 = vpandn_avx2(_local_9e0,local_9c0);
          local_8a0 = _local_400;
          local_9a0._4_4_ = (float)local_a60._4_4_ + (float)local_400._4_4_;
          local_9a0._0_4_ = (float)local_a60._0_4_ + (float)local_400._0_4_;
          fStack_998 = fStack_a58 + fStack_3f8;
          fStack_994 = fStack_a54 + fStack_3f4;
          fStack_990 = fStack_a50 + fStack_3f0;
          fStack_98c = fStack_a4c + fStack_3ec;
          fStack_988 = fStack_a48 + fStack_3e8;
          fStack_984 = fStack_a44 + fStack_3e4;
          while( true ) {
            if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_5a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_5a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_5a0 >> 0x7f,0) == '\0') &&
                  (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_5a0 >> 0xbf,0) == '\0') &&
                (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_5a0[0x1f]) break;
            auVar140._8_4_ = 0x7f800000;
            auVar140._0_8_ = 0x7f8000007f800000;
            auVar140._12_4_ = 0x7f800000;
            auVar140._16_4_ = 0x7f800000;
            auVar140._20_4_ = 0x7f800000;
            auVar140._24_4_ = 0x7f800000;
            auVar140._28_4_ = 0x7f800000;
            auVar105 = vblendvps_avx(auVar140,local_8a0,local_5a0);
            auVar160 = vshufps_avx(auVar105,auVar105,0xb1);
            auVar160 = vminps_avx(auVar105,auVar160);
            auVar106 = vshufpd_avx(auVar160,auVar160,5);
            auVar160 = vminps_avx(auVar160,auVar106);
            auVar106 = vpermpd_avx2(auVar160,0x4e);
            auVar160 = vminps_avx(auVar160,auVar106);
            auVar160 = vcmpps_avx(auVar105,auVar160,0);
            auVar106 = local_5a0 & auVar160;
            auVar105 = local_5a0;
            if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar106 >> 0x7f,0) != '\0') ||
                  (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0xbf,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar106[0x1f] < '\0') {
              auVar105 = vandps_avx(auVar160,local_5a0);
            }
            uVar79 = vmovmskps_avx(auVar105);
            iVar78 = 0;
            for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
              iVar78 = iVar78 + 1;
            }
            uVar82 = iVar78 << 2;
            *(undefined4 *)(local_5a0 + uVar82) = 0;
            uVar79 = *(uint *)(local_1c0 + uVar82);
            uVar82 = *(uint *)(local_3e0 + uVar82);
            fVar199 = auVar7._0_4_;
            if ((float)local_a80._0_4_ < 0.0) {
              auVar244 = ZEXT1664(auVar244._0_16_);
              auVar271 = ZEXT1664(auVar271._0_16_);
              fVar199 = sqrtf((float)local_a80._0_4_);
            }
            auVar240 = ZEXT464(uVar82);
            auVar228 = ZEXT464(uVar79);
            auVar92 = vminps_avx(auVar9,auVar11);
            auVar93 = vmaxps_avx(auVar9,auVar11);
            auVar143 = vminps_avx(auVar10,auVar8);
            auVar96 = vminps_avx(auVar92,auVar143);
            auVar92 = vmaxps_avx(auVar10,auVar8);
            auVar143 = vmaxps_avx(auVar93,auVar92);
            auVar93 = vandps_avx(auVar96,auVar242);
            auVar92 = vandps_avx(auVar143,auVar242);
            auVar93 = vmaxps_avx(auVar93,auVar92);
            auVar92 = vmovshdup_avx(auVar93);
            auVar92 = vmaxss_avx(auVar92,auVar93);
            auVar93 = vshufpd_avx(auVar93,auVar93,1);
            auVar93 = vmaxss_avx(auVar93,auVar92);
            local_ae0._0_4_ = auVar93._0_4_ * 1.9073486e-06;
            local_900._0_4_ = fVar199 * 1.9073486e-06;
            local_940._0_16_ = vshufps_avx(auVar143,auVar143,0xff);
            auVar93 = vinsertps_avx(ZEXT416(uVar82),ZEXT416(uVar79),0x10);
            auVar142 = ZEXT1664(auVar93);
            lVar81 = 5;
            do {
              do {
                bVar87 = lVar81 == 0;
                lVar81 = lVar81 + -1;
                if (bVar87) goto LAB_0116fcc2;
                uVar85 = auVar142._0_4_;
                auVar100._4_4_ = uVar85;
                auVar100._0_4_ = uVar85;
                auVar100._8_4_ = uVar85;
                auVar100._12_4_ = uVar85;
                auVar92 = vfmadd213ps_fma(auVar100,local_a70,_DAT_01f45a50);
                auVar164 = auVar142._0_16_;
                local_b20 = vmovshdup_avx(auVar164);
                fVar219 = local_b20._0_4_;
                fVar218 = 1.0 - fVar219;
                auVar124 = SUB6416(ZEXT464(0x40400000),0);
                auVar91 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar143 = vfmadd213ss_fma(auVar124,local_b20,auVar91);
                auVar93 = vfmadd213ss_fma(auVar143,ZEXT416((uint)(fVar219 * fVar219)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar96 = vfmadd213ss_fma(auVar124,ZEXT416((uint)fVar218),auVar91);
                auVar96 = vfmadd213ss_fma(auVar96,ZEXT416((uint)(fVar218 * fVar218)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar199 = fVar218 * fVar218 * -fVar219 * 0.5;
                fVar215 = auVar93._0_4_ * 0.5;
                fVar216 = auVar96._0_4_ * 0.5;
                fVar217 = fVar219 * fVar219 * -fVar218 * 0.5;
                auVar171._0_4_ = fVar217 * fVar122;
                auVar171._4_4_ = fVar217 * fStack_bcc;
                auVar171._8_4_ = fVar217 * fStack_bc8;
                auVar171._12_4_ = fVar217 * fStack_bc4;
                auVar193._4_4_ = fVar216;
                auVar193._0_4_ = fVar216;
                auVar193._8_4_ = fVar216;
                auVar193._12_4_ = fVar216;
                auVar93 = vfmadd132ps_fma(auVar193,auVar171,auVar10);
                auVar150._4_4_ = fVar215;
                auVar150._0_4_ = fVar215;
                auVar150._8_4_ = fVar215;
                auVar150._12_4_ = fVar215;
                auVar93 = vfmadd132ps_fma(auVar150,auVar93,auVar11);
                auVar172._4_4_ = fVar199;
                auVar172._0_4_ = fVar199;
                auVar172._8_4_ = fVar199;
                auVar172._12_4_ = fVar199;
                auVar93 = vfmadd132ps_fma(auVar172,auVar93,auVar9);
                auVar91 = vfmadd231ss_fma(auVar91,local_b20,ZEXT416(0x41100000));
                auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_b20,
                                          ZEXT416(0x40800000));
                local_b00._0_16_ = auVar96;
                local_8e0._0_16_ = auVar93;
                auVar93 = vsubps_avx(auVar92,auVar93);
                _local_aa0 = auVar93;
                auVar93 = vdpps_avx(auVar93,auVar93,0x7f);
                auVar92 = vfmadd213ss_fma(auVar124,local_b20,ZEXT416(0xbf800000));
                fVar199 = auVar93._0_4_;
                if (fVar199 < 0.0) {
                  local_b40._0_16_ = auVar91;
                  local_b60._0_4_ = fVar218 * -2.0;
                  auVar228._0_4_ = sqrtf(fVar199);
                  auVar228._4_60_ = extraout_var_00;
                  auVar143 = ZEXT416(auVar143._0_4_);
                  auVar142 = ZEXT1664(auVar164);
                  auVar96 = auVar228._0_16_;
                  fVar215 = (float)local_b60._0_4_;
                  auVar91 = local_b40._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar93,auVar93);
                  fVar215 = fVar218 * -2.0;
                }
                fVar216 = local_b20._0_4_;
                auVar124 = vfmadd213ss_fma(auVar143,ZEXT416((uint)(fVar216 + fVar216)),
                                           ZEXT416((uint)(fVar216 * fVar216 * 3.0)));
                auVar123 = SUB6416(ZEXT464(0x40000000),0);
                auVar143 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_b20,auVar123);
                auVar189 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar218 * -3.0)),
                                           ZEXT416((uint)(fVar218 + fVar218)),auVar143);
                auVar90 = vfnmadd231ss_fma(ZEXT416((uint)(fVar216 * (fVar218 + fVar218))),
                                           ZEXT416((uint)fVar218),ZEXT416((uint)fVar218));
                auVar143 = vfmadd213ss_fma(ZEXT416((uint)fVar215),local_b20,
                                           ZEXT416((uint)(fVar219 * fVar219)));
                fVar215 = auVar189._0_4_ * 0.5;
                fVar216 = auVar143._0_4_ * 0.5;
                auVar151._0_4_ = fVar122 * fVar216;
                auVar151._4_4_ = fStack_bcc * fVar216;
                auVar151._8_4_ = fStack_bc8 * fVar216;
                auVar151._12_4_ = fStack_bc4 * fVar216;
                auVar129._4_4_ = fVar215;
                auVar129._0_4_ = fVar215;
                auVar129._8_4_ = fVar215;
                auVar129._12_4_ = fVar215;
                auVar143 = vfmadd213ps_fma(auVar129,auVar10,auVar151);
                fVar215 = auVar90._0_4_ * 0.5;
                fVar216 = auVar124._0_4_ * 0.5;
                auVar152._4_4_ = fVar216;
                auVar152._0_4_ = fVar216;
                auVar152._8_4_ = fVar216;
                auVar152._12_4_ = fVar216;
                auVar143 = vfmadd213ps_fma(auVar152,auVar11,auVar143);
                auVar259._4_4_ = fVar215;
                auVar259._0_4_ = fVar215;
                auVar259._8_4_ = fVar215;
                auVar259._12_4_ = fVar215;
                auVar124 = vfmadd213ps_fma(auVar259,auVar9,auVar143);
                auVar189 = vfmadd213ss_fma(local_b20,SUB6416(ZEXT464(0xc0400000),0),auVar123);
                local_c00 = auVar92._0_4_;
                auVar101._0_4_ = fVar122 * local_c00;
                auVar101._4_4_ = fStack_bcc * local_c00;
                auVar101._8_4_ = fStack_bc8 * local_c00;
                auVar101._12_4_ = fStack_bc4 * local_c00;
                auVar130._4_4_ = local_b00._0_4_;
                auVar130._0_4_ = local_b00._0_4_;
                auVar130._8_4_ = local_b00._0_4_;
                auVar130._12_4_ = local_b00._0_4_;
                auVar92 = vfmadd213ps_fma(auVar130,auVar10,auVar101);
                uVar85 = auVar91._0_4_;
                auVar153._4_4_ = uVar85;
                auVar153._0_4_ = uVar85;
                auVar153._8_4_ = uVar85;
                auVar153._12_4_ = uVar85;
                auVar92 = vfmadd213ps_fma(auVar153,auVar11,auVar92);
                auVar143 = vdpps_avx(auVar124,auVar124,0x7f);
                uVar85 = auVar189._0_4_;
                auVar131._4_4_ = uVar85;
                auVar131._0_4_ = uVar85;
                auVar131._8_4_ = uVar85;
                auVar131._12_4_ = uVar85;
                auVar189 = vfmadd213ps_fma(auVar131,auVar9,auVar92);
                auVar92 = vblendps_avx(auVar143,_DAT_01f45a50,0xe);
                auVar91 = vrsqrtss_avx(auVar92,auVar92);
                fVar217 = auVar143._0_4_;
                fVar215 = auVar91._0_4_;
                auVar91 = vdpps_avx(auVar124,auVar189,0x7f);
                fVar215 = fVar215 * 1.5 + fVar217 * -0.5 * fVar215 * fVar215 * fVar215;
                auVar132._0_4_ = auVar189._0_4_ * fVar217;
                auVar132._4_4_ = auVar189._4_4_ * fVar217;
                auVar132._8_4_ = auVar189._8_4_ * fVar217;
                auVar132._12_4_ = auVar189._12_4_ * fVar217;
                fVar216 = auVar91._0_4_;
                auVar205._0_4_ = auVar124._0_4_ * fVar216;
                auVar205._4_4_ = auVar124._4_4_ * fVar216;
                fVar218 = auVar124._8_4_;
                auVar205._8_4_ = fVar218 * fVar216;
                fVar219 = auVar124._12_4_;
                auVar205._12_4_ = fVar219 * fVar216;
                auVar91 = vsubps_avx(auVar132,auVar205);
                auVar92 = vrcpss_avx(auVar92,auVar92);
                auVar189 = vfnmadd213ss_fma(auVar92,auVar143,auVar123);
                fVar216 = auVar92._0_4_ * auVar189._0_4_;
                auVar92 = vmaxss_avx(ZEXT416((uint)local_ae0._0_4_),
                                     ZEXT416((uint)(auVar142._0_4_ * (float)local_900._0_4_)));
                auVar244 = ZEXT1664(auVar92);
                auVar238._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
                auVar238._8_4_ = -fVar218;
                auVar238._12_4_ = -fVar219;
                auVar173._0_4_ = fVar215 * auVar91._0_4_ * fVar216;
                auVar173._4_4_ = fVar215 * auVar91._4_4_ * fVar216;
                auVar173._8_4_ = fVar215 * auVar91._8_4_ * fVar216;
                auVar173._12_4_ = fVar215 * auVar91._12_4_ * fVar216;
                auVar251._0_4_ = auVar124._0_4_ * fVar215;
                auVar251._4_4_ = auVar124._4_4_ * fVar215;
                auVar251._8_4_ = fVar218 * fVar215;
                auVar251._12_4_ = fVar219 * fVar215;
                local_b00._0_4_ = auVar92._0_4_;
                local_b20 = auVar124;
                if (fVar217 < -fVar217) {
                  fVar215 = sqrtf(fVar217);
                  auVar244 = ZEXT464((uint)local_b00._0_4_);
                  auVar96 = ZEXT416(auVar96._0_4_);
                }
                else {
                  auVar92 = vsqrtss_avx(auVar143,auVar143);
                  fVar215 = auVar92._0_4_;
                }
                auVar92 = vdpps_avx(_local_aa0,auVar251,0x7f);
                auVar189 = vfmadd213ss_fma(ZEXT416((uint)local_ae0._0_4_),auVar96,auVar244._0_16_);
                auVar143 = vdpps_avx(auVar238,auVar251,0x7f);
                auVar91 = vdpps_avx(_local_aa0,auVar173,0x7f);
                auVar124 = vdpps_avx(local_a70,auVar251,0x7f);
                auVar189 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_ae0._0_4_ / fVar215)),
                                           auVar189);
                fVar215 = auVar143._0_4_ + auVar91._0_4_;
                auVar271 = ZEXT464((uint)fVar215);
                fVar217 = auVar92._0_4_;
                auVar102._0_4_ = fVar217 * fVar217;
                auVar102._4_4_ = auVar92._4_4_ * auVar92._4_4_;
                auVar102._8_4_ = auVar92._8_4_ * auVar92._8_4_;
                auVar102._12_4_ = auVar92._12_4_ * auVar92._12_4_;
                auVar143 = vdpps_avx(_local_aa0,auVar238,0x7f);
                auVar91 = vsubps_avx(auVar93,auVar102);
                auVar96 = vrsqrtss_avx(auVar91,auVar91);
                fVar218 = auVar91._0_4_;
                fVar216 = auVar96._0_4_;
                fVar216 = fVar216 * 1.5 + fVar218 * -0.5 * fVar216 * fVar216 * fVar216;
                auVar96 = vdpps_avx(_local_aa0,local_a70,0x7f);
                auVar143 = vfnmadd231ss_fma(auVar143,auVar92,ZEXT416((uint)fVar215));
                auVar96 = vfnmadd231ss_fma(auVar96,auVar92,auVar124);
                if (fVar218 < 0.0) {
                  local_b40._0_16_ = auVar143;
                  local_b60._0_4_ = fVar216;
                  local_920._0_16_ = auVar96;
                  fVar218 = sqrtf(fVar218);
                  auVar271 = ZEXT1664(ZEXT416((uint)fVar215));
                  auVar244 = ZEXT464((uint)local_b00._0_4_);
                  fVar216 = (float)local_b60._0_4_;
                  auVar96 = local_920._0_16_;
                  auVar143 = local_b40._0_16_;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  fVar218 = auVar91._0_4_;
                }
                auVar228 = ZEXT1664(auVar93);
                auVar240 = ZEXT1664(local_b20);
                auVar91 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar218 = fVar218 - auVar91._0_4_;
                auVar91 = vshufps_avx(local_b20,local_b20,0xff);
                auVar143 = vfmsub213ss_fma(auVar143,ZEXT416((uint)fVar216),auVar91);
                auVar174._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
                auVar174._8_4_ = auVar124._8_4_ ^ 0x80000000;
                auVar174._12_4_ = auVar124._12_4_ ^ 0x80000000;
                auVar194._0_8_ = auVar143._0_8_ ^ 0x8000000080000000;
                auVar194._8_4_ = auVar143._8_4_ ^ 0x80000000;
                auVar194._12_4_ = auVar143._12_4_ ^ 0x80000000;
                auVar90 = ZEXT416((uint)(auVar96._0_4_ * fVar216));
                auVar123 = auVar271._0_16_;
                auVar96 = vfmsub231ss_fma(ZEXT416((uint)(auVar124._0_4_ * auVar143._0_4_)),auVar123,
                                          auVar90);
                auVar143 = vinsertps_avx(auVar194,auVar90,0x1c);
                uVar85 = auVar96._0_4_;
                auVar195._4_4_ = uVar85;
                auVar195._0_4_ = uVar85;
                auVar195._8_4_ = uVar85;
                auVar195._12_4_ = uVar85;
                auVar143 = vdivps_avx(auVar143,auVar195);
                auVar96 = vinsertps_avx(auVar123,auVar174,0x10);
                auVar96 = vdivps_avx(auVar96,auVar195);
                auVar154._0_4_ = fVar217 * auVar143._0_4_ + fVar218 * auVar96._0_4_;
                auVar154._4_4_ = fVar217 * auVar143._4_4_ + fVar218 * auVar96._4_4_;
                auVar154._8_4_ = fVar217 * auVar143._8_4_ + fVar218 * auVar96._8_4_;
                auVar154._12_4_ = fVar217 * auVar143._12_4_ + fVar218 * auVar96._12_4_;
                auVar143 = vsubps_avx(auVar164,auVar154);
                auVar142 = ZEXT1664(auVar143);
                auVar92 = vandps_avx(auVar92,auVar242);
              } while (auVar189._0_4_ <= auVar92._0_4_);
              auVar96 = vfmadd231ss_fma(ZEXT416((uint)(auVar244._0_4_ + auVar189._0_4_)),
                                        local_940._0_16_,ZEXT416(0x36000000));
              auVar92 = vandps_avx(ZEXT416((uint)fVar218),auVar242);
            } while (auVar96._0_4_ <= auVar92._0_4_);
            fVar215 = auVar143._0_4_ + (float)local_a20._0_4_;
            if (fVar88 <= fVar215) {
              fVar216 = *(float *)(ray + k * 4 + 0x100);
              auVar244 = ZEXT464((uint)fVar216);
              if (fVar215 <= fVar216) {
                auVar92 = vmovshdup_avx(auVar143);
                fVar217 = auVar92._0_4_;
                if ((0.0 <= fVar217) && (fVar217 <= 1.0)) {
                  auVar143 = vrsqrtss_avx(auVar93,auVar93);
                  fVar218 = auVar143._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar80].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    fVar199 = fVar218 * 1.5 + fVar199 * -0.5 * fVar218 * fVar218 * fVar218;
                    auVar175._0_4_ = fVar199 * (float)local_aa0._0_4_;
                    auVar175._4_4_ = fVar199 * (float)local_aa0._4_4_;
                    auVar175._8_4_ = fVar199 * fStack_a98;
                    auVar175._12_4_ = fVar199 * fStack_a94;
                    auVar124 = vfmadd213ps_fma(auVar91,auVar175,local_b20);
                    auVar143 = vshufps_avx(auVar175,auVar175,0xc9);
                    auVar96 = vshufps_avx(local_b20,local_b20,0xc9);
                    auVar176._0_4_ = auVar175._0_4_ * auVar96._0_4_;
                    auVar176._4_4_ = auVar175._4_4_ * auVar96._4_4_;
                    auVar176._8_4_ = auVar175._8_4_ * auVar96._8_4_;
                    auVar176._12_4_ = auVar175._12_4_ * auVar96._12_4_;
                    auVar91 = vfmsub231ps_fma(auVar176,local_b20,auVar143);
                    auVar143 = vshufps_avx(auVar91,auVar91,0xc9);
                    auVar96 = vshufps_avx(auVar124,auVar124,0xc9);
                    auVar91 = vshufps_avx(auVar91,auVar91,0xd2);
                    auVar103._0_4_ = auVar124._0_4_ * auVar91._0_4_;
                    auVar103._4_4_ = auVar124._4_4_ * auVar91._4_4_;
                    auVar103._8_4_ = auVar124._8_4_ * auVar91._8_4_;
                    auVar103._12_4_ = auVar124._12_4_ * auVar91._12_4_;
                    auVar143 = vfmsub231ps_fma(auVar103,auVar143,auVar96);
                    uVar85 = auVar143._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar215;
                      uVar2 = vextractps_avx(auVar143,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar2;
                      uVar2 = vextractps_avx(auVar143,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar2;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar85;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar217;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_a00;
                      *(uint *)(ray + k * 4 + 0x240) = uVar80;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar5 = context->user;
                      local_4c0 = auVar92._0_8_;
                      auVar92 = vmovshdup_avx(auVar143);
                      local_520._8_8_ = auVar92._0_8_;
                      auVar92 = vshufps_avx(auVar143,auVar143,0xaa);
                      local_500 = auVar92._0_8_;
                      local_520._0_8_ = local_520._8_8_;
                      local_520._16_8_ = local_520._8_8_;
                      local_520._24_8_ = local_520._8_8_;
                      uStack_4f8 = local_500;
                      uStack_4f0 = local_500;
                      uStack_4e8 = local_500;
                      local_4e0 = uVar85;
                      uStack_4dc = uVar85;
                      uStack_4d8 = uVar85;
                      uStack_4d4 = uVar85;
                      uStack_4d0 = uVar85;
                      uStack_4cc = uVar85;
                      uStack_4c8 = uVar85;
                      uStack_4c4 = uVar85;
                      uStack_4b8 = local_4c0;
                      uStack_4b0 = local_4c0;
                      uStack_4a8 = local_4c0;
                      auVar155._12_4_ = 0;
                      auVar155._0_12_ = ZEXT812(0);
                      auVar155 = auVar155 << 0x20;
                      local_4a0 = ZEXT1232(ZEXT812(0)) << 0x20;
                      local_480 = CONCAT44(uStack_79c,local_7a0);
                      uStack_478 = CONCAT44(uStack_794,uStack_798);
                      uStack_470 = CONCAT44(uStack_78c,uStack_790);
                      uStack_468 = CONCAT44(uStack_784,uStack_788);
                      local_460._4_4_ = uStack_77c;
                      local_460._0_4_ = local_780;
                      local_460._8_4_ = uStack_778;
                      local_460._12_4_ = uStack_774;
                      local_460._16_4_ = uStack_770;
                      local_460._20_4_ = uStack_76c;
                      local_460._24_4_ = uStack_768;
                      local_460._28_4_ = uStack_764;
                      auVar105 = vpcmpeqd_avx2(local_460,local_460);
                      local_aa8[1] = auVar105;
                      *local_aa8 = auVar105;
                      local_440 = pRVar5->instID[0];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_420 = pRVar5->instPrimID[0];
                      uStack_41c = local_420;
                      uStack_418 = local_420;
                      uStack_414 = local_420;
                      uStack_410 = local_420;
                      uStack_40c = local_420;
                      uStack_408 = local_420;
                      uStack_404 = local_420;
                      *(float *)(ray + k * 4 + 0x100) = fVar215;
                      local_a40 = local_7c0;
                      local_b90.valid = (int *)local_a40;
                      local_b90.geometryUserPtr = pGVar3->userPtr;
                      local_b90.context = context->user;
                      local_b90.hit = (RTCHitN *)local_520;
                      local_b90.N = 8;
                      local_b90.ray = (RTCRayN *)ray;
                      if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar228 = ZEXT1664(auVar93);
                        auVar240 = ZEXT1664(local_b20);
                        auVar271 = ZEXT1664(auVar123);
                        (*pGVar3->intersectionFilterN)(&local_b90);
                        auVar155 = ZEXT816(0) << 0x40;
                      }
                      auVar160 = ZEXT1632(auVar155);
                      auVar105 = vpcmpeqd_avx2(local_a40,auVar160);
                      auVar105 = _DAT_01f7b020 & ~auVar105;
                      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar105 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar105 >> 0x7f,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar105 >> 0xbf,0) != '\0') ||
                          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar105[0x1f] < '\0') {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar228 = ZEXT1664(auVar228._0_16_);
                          auVar240 = ZEXT1664(auVar240._0_16_);
                          auVar271 = ZEXT1664(auVar271._0_16_);
                          (*p_Var4)(&local_b90);
                          auVar160 = ZEXT832(0) << 0x40;
                        }
                        auVar244 = ZEXT464((uint)fVar216);
                        auVar160 = vpcmpeqd_avx2(local_a40,auVar160);
                        auVar105 = _DAT_01f7b020 & ~auVar160;
                        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar105 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar105 >> 0x7f,0) != '\0')
                              || (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar105 >> 0xbf,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar105[0x1f] < '\0') {
                          auVar120._0_8_ = auVar160._0_8_ ^ 0xffffffffffffffff;
                          auVar120._8_4_ = auVar160._8_4_ ^ 0xffffffff;
                          auVar120._12_4_ = auVar160._12_4_ ^ 0xffffffff;
                          auVar120._16_4_ = auVar160._16_4_ ^ 0xffffffff;
                          auVar120._20_4_ = auVar160._20_4_ ^ 0xffffffff;
                          auVar120._24_4_ = auVar160._24_4_ ^ 0xffffffff;
                          auVar120._28_4_ = auVar160._28_4_ ^ 0xffffffff;
                          auVar105 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])local_b90.hit);
                          *(undefined1 (*) [32])(local_b90.ray + 0x180) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                              (local_b90.hit + 0x20));
                          *(undefined1 (*) [32])(local_b90.ray + 0x1a0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                              (local_b90.hit + 0x40));
                          *(undefined1 (*) [32])(local_b90.ray + 0x1c0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                              (local_b90.hit + 0x60));
                          *(undefined1 (*) [32])(local_b90.ray + 0x1e0) = auVar105;
                          auVar105 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                              (local_b90.hit + 0x80));
                          *(undefined1 (*) [32])(local_b90.ray + 0x200) = auVar105;
                          auVar105 = vpmaskmovd_avx2(auVar120,*(undefined1 (*) [32])
                                                               (local_b90.hit + 0xa0));
                          *(undefined1 (*) [32])(local_b90.ray + 0x220) = auVar105;
                          auVar105 = vpmaskmovd_avx2(auVar120,*(undefined1 (*) [32])
                                                               (local_b90.hit + 0xc0));
                          *(undefined1 (*) [32])(local_b90.ray + 0x240) = auVar105;
                          auVar105 = vpmaskmovd_avx2(auVar120,*(undefined1 (*) [32])
                                                               (local_b90.hit + 0xe0));
                          *(undefined1 (*) [32])(local_b90.ray + 0x260) = auVar105;
                          auVar105 = vpmaskmovd_avx2(auVar120,*(undefined1 (*) [32])
                                                               (local_b90.hit + 0x100));
                          *(undefined1 (*) [32])(local_b90.ray + 0x280) = auVar105;
                          goto LAB_0116fcc2;
                        }
                      }
                      auVar244 = ZEXT464((uint)fVar216);
                      *(float *)(ray + k * 4 + 0x100) = fVar216;
                    }
                  }
                }
              }
            }
LAB_0116fcc2:
            uVar85 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar262._4_4_ = uVar85;
            auVar262._0_4_ = uVar85;
            auVar262._8_4_ = uVar85;
            auVar262._12_4_ = uVar85;
            auVar262._16_4_ = uVar85;
            auVar262._20_4_ = uVar85;
            auVar262._24_4_ = uVar85;
            auVar262._28_4_ = uVar85;
            auVar263 = ZEXT3264(auVar262);
            auVar105 = vcmpps_avx(_local_9a0,auVar262,2);
            local_5a0 = vandps_avx(auVar105,local_5a0);
          }
          auVar141._0_4_ = (float)local_a60._0_4_ + local_560._0_4_;
          auVar141._4_4_ = (float)local_a60._4_4_ + local_560._4_4_;
          auVar141._8_4_ = fStack_a58 + local_560._8_4_;
          auVar141._12_4_ = fStack_a54 + local_560._12_4_;
          auVar141._16_4_ = fStack_a50 + local_560._16_4_;
          auVar141._20_4_ = fStack_a4c + local_560._20_4_;
          auVar141._24_4_ = fStack_a48 + local_560._24_4_;
          auVar141._28_4_ = fStack_a44 + local_560._28_4_;
          uVar85 = auVar263._0_4_;
          auVar182._4_4_ = uVar85;
          auVar182._0_4_ = uVar85;
          auVar182._8_4_ = uVar85;
          auVar182._12_4_ = uVar85;
          auVar182._16_4_ = uVar85;
          auVar182._20_4_ = uVar85;
          auVar182._24_4_ = uVar85;
          auVar182._28_4_ = uVar85;
          auVar160 = vcmpps_avx(auVar141,auVar182,2);
          auVar105 = vandps_avx(local_820,local_800);
          auVar105 = vandps_avx(auVar160,auVar105);
          auVar197._0_4_ = (float)local_a60._0_4_ + local_400._0_4_;
          auVar197._4_4_ = (float)local_a60._4_4_ + local_400._4_4_;
          auVar197._8_4_ = fStack_a58 + local_400._8_4_;
          auVar197._12_4_ = fStack_a54 + local_400._12_4_;
          auVar197._16_4_ = fStack_a50 + local_400._16_4_;
          auVar197._20_4_ = fStack_a4c + local_400._20_4_;
          auVar197._24_4_ = fStack_a48 + local_400._24_4_;
          auVar197._28_4_ = fStack_a44 + local_400._28_4_;
          auVar106 = vcmpps_avx(auVar197,auVar182,2);
          auVar160 = vandps_avx(_local_9e0,local_9c0);
          auVar160 = vandps_avx(auVar106,auVar160);
          auVar160 = vorps_avx(auVar105,auVar160);
          fVar234 = (float)local_a60._0_4_;
          fVar241 = (float)local_a60._4_4_;
          fVar245 = fStack_a58;
          fVar246 = fStack_a54;
          fVar247 = fStack_a50;
          fVar289 = fStack_a4c;
          fVar273 = fStack_a48;
          fVar274 = fStack_a44;
          if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar160 >> 0x7f,0) != '\0') ||
                (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0xbf,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar160[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar83 * 0x60) = auVar160;
            auVar105 = vblendvps_avx(_local_400,local_560,auVar105);
            *(undefined1 (*) [32])(auStack_160 + uVar83 * 0x60) = auVar105;
            uVar18 = vmovlps_avx(local_7d0);
            (&uStack_140)[uVar83 * 0xc] = uVar18;
            aiStack_138[uVar83 * 0x18] = local_cc4 + 1;
            uVar83 = (ulong)((int)uVar83 + 1);
          }
          goto LAB_0116e686;
        }
      }
      auVar228 = ZEXT3264(auVar105);
      auVar244 = ZEXT3264(auVar160);
    }
LAB_0116e686:
    while( true ) {
      uVar79 = (uint)uVar83;
      if (uVar79 == 0) {
        uVar85 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar104._4_4_ = uVar85;
        auVar104._0_4_ = uVar85;
        auVar104._8_4_ = uVar85;
        auVar104._12_4_ = uVar85;
        auVar6 = vcmpps_avx(local_7e0,auVar104,2);
        uVar80 = vmovmskps_avx(auVar6);
        uVar86 = (ulong)((uint)uVar86 & uVar80);
        goto LAB_0116d70d;
      }
      uVar83 = (ulong)(uVar79 - 1);
      lVar81 = uVar83 * 0x60;
      auVar105 = *(undefined1 (*) [32])(auStack_160 + lVar81);
      auVar115._0_4_ = fVar234 + auVar105._0_4_;
      auVar115._4_4_ = fVar241 + auVar105._4_4_;
      auVar115._8_4_ = fVar245 + auVar105._8_4_;
      auVar115._12_4_ = fVar246 + auVar105._12_4_;
      auVar115._16_4_ = fVar247 + auVar105._16_4_;
      auVar115._20_4_ = fVar289 + auVar105._20_4_;
      auVar115._24_4_ = fVar273 + auVar105._24_4_;
      auVar115._28_4_ = fVar274 + auVar105._28_4_;
      uVar85 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar180._4_4_ = uVar85;
      auVar180._0_4_ = uVar85;
      auVar180._8_4_ = uVar85;
      auVar180._12_4_ = uVar85;
      auVar180._16_4_ = uVar85;
      auVar180._20_4_ = uVar85;
      auVar180._24_4_ = uVar85;
      auVar180._28_4_ = uVar85;
      auVar106 = vcmpps_avx(auVar115,auVar180,2);
      auVar160 = vandps_avx(auVar106,*(undefined1 (*) [32])(auStack_180 + lVar81));
      local_520 = auVar160;
      auVar106 = *(undefined1 (*) [32])(auStack_180 + lVar81) & auVar106;
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0x7f,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar106 >> 0xbf,0) != '\0') ||
          (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar106[0x1f] < '\0') break;
      uVar83 = (ulong)(uVar79 - 1);
    }
    auVar158._8_4_ = 0x7f800000;
    auVar158._0_8_ = 0x7f8000007f800000;
    auVar158._12_4_ = 0x7f800000;
    auVar158._16_4_ = 0x7f800000;
    auVar158._20_4_ = 0x7f800000;
    auVar158._24_4_ = 0x7f800000;
    auVar158._28_4_ = 0x7f800000;
    auVar105 = vblendvps_avx(auVar158,auVar105,auVar160);
    auVar106 = vshufps_avx(auVar105,auVar105,0xb1);
    auVar106 = vminps_avx(auVar105,auVar106);
    auVar13 = vshufpd_avx(auVar106,auVar106,5);
    auVar106 = vminps_avx(auVar106,auVar13);
    auVar13 = vpermpd_avx2(auVar106,0x4e);
    auVar106 = vminps_avx(auVar106,auVar13);
    auVar105 = vcmpps_avx(auVar105,auVar106,0);
    auVar106 = auVar160 & auVar105;
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar106 >> 0x7f,0) != '\0') ||
          (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar106 >> 0xbf,0) != '\0') ||
        (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar106[0x1f] < '\0') {
      auVar160 = vandps_avx(auVar105,auVar160);
    }
    uVar82 = vmovmskps_avx(auVar160);
    iVar78 = 0;
    for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
      iVar78 = iVar78 + 1;
    }
    *(undefined4 *)(local_520 + (uint)(iVar78 << 2)) = 0;
    uVar18 = (&uStack_140)[uVar83 * 0xc];
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar18;
    local_cc4 = aiStack_138[uVar83 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar81) = local_520;
    uVar82 = uVar79 - 1;
    if ((((((((local_520 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_520 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_520 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_520 >> 0x7f,0) != '\0') ||
          (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_520 >> 0xbf,0) != '\0') ||
        (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_520[0x1f] < '\0') {
      uVar82 = uVar79;
    }
    uVar85 = (undefined4)uVar18;
    auVar135._4_4_ = uVar85;
    auVar135._0_4_ = uVar85;
    auVar135._8_4_ = uVar85;
    auVar135._12_4_ = uVar85;
    auVar135._16_4_ = uVar85;
    auVar135._20_4_ = uVar85;
    auVar135._24_4_ = uVar85;
    auVar135._28_4_ = uVar85;
    auVar93 = vmovshdup_avx(auVar94);
    auVar93 = vsubps_avx(auVar93,auVar94);
    auVar116._0_4_ = auVar93._0_4_;
    auVar116._4_4_ = auVar116._0_4_;
    auVar116._8_4_ = auVar116._0_4_;
    auVar116._12_4_ = auVar116._0_4_;
    auVar116._16_4_ = auVar116._0_4_;
    auVar116._20_4_ = auVar116._0_4_;
    auVar116._24_4_ = auVar116._0_4_;
    auVar116._28_4_ = auVar116._0_4_;
    auVar93 = vfmadd132ps_fma(auVar116,auVar135,_DAT_01f7b040);
    local_560 = ZEXT1632(auVar93);
    auVar142 = ZEXT864(*(ulong *)(local_560 + (uint)(iVar78 << 2)));
    uVar83 = (ulong)uVar82;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }